

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<4,16>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  byte bVar21;
  uint uVar22;
  ulong uVar23;
  long lVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  bool bVar29;
  uint uVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar103 [48];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar91 [64];
  undefined1 auVar93 [64];
  undefined1 auVar95 [64];
  undefined1 auVar97 [64];
  undefined1 auVar99 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  int iVar104;
  float fVar105;
  undefined4 uVar106;
  float fVar114;
  vint4 bi_2;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [64];
  vint4 bi_1;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  vint4 bi;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  float fVar129;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  vint4 ai_2;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  vint4 ai_1;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  vint4 ai;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar181;
  float fVar191;
  float fVar192;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar193;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  __m128 a;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  vfloat4 a0_2;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  float fVar220;
  float fVar230;
  float fVar232;
  vfloat4 a0_3;
  undefined1 auVar221 [16];
  float fVar231;
  float fVar233;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar247;
  vfloat4 b0_2;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  vfloat4 b0_3;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  uint auStack_600 [4];
  RTCFilterFunctionNArguments local_5f0;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined1 local_400 [64];
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar24;
  undefined1 auVar90 [64];
  undefined1 auVar92 [64];
  undefined1 auVar94 [64];
  undefined1 auVar96 [64];
  undefined1 auVar98 [64];
  undefined1 auVar100 [64];
  float fVar144;
  
  PVar6 = prim[1];
  uVar23 = (ulong)(byte)PVar6;
  lVar25 = uVar23 * 0x25;
  fVar105 = *(float *)(prim + lVar25 + 0x12);
  auVar36 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar37 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar37 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar36 = vsubps_avx(auVar36,*(undefined1 (*) [16])(prim + lVar25 + 6));
  auVar59._0_4_ = fVar105 * auVar36._0_4_;
  auVar59._4_4_ = fVar105 * auVar36._4_4_;
  auVar59._8_4_ = fVar105 * auVar36._8_4_;
  auVar59._12_4_ = fVar105 * auVar36._12_4_;
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 4 + 6)));
  auVar39._0_4_ = fVar105 * auVar37._0_4_;
  auVar39._4_4_ = fVar105 * auVar37._4_4_;
  auVar39._8_4_ = fVar105 * auVar37._8_4_;
  auVar39._12_4_ = fVar105 * auVar37._12_4_;
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 5 + 6)));
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 6 + 6)));
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0xf + 6)));
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar23 + 6)));
  auVar48 = vcvtdq2ps_avx(auVar48);
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0x1a + 6)));
  auVar49 = vcvtdq2ps_avx(auVar49);
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0x1b + 6)));
  auVar50 = vcvtdq2ps_avx(auVar50);
  auVar52 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0x1c + 6)));
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar151._4_4_ = auVar39._0_4_;
  auVar151._0_4_ = auVar39._0_4_;
  auVar151._8_4_ = auVar39._0_4_;
  auVar151._12_4_ = auVar39._0_4_;
  auVar53 = vshufps_avx(auVar39,auVar39,0x55);
  auVar54 = vshufps_avx(auVar39,auVar39,0xaa);
  fVar105 = auVar54._0_4_;
  auVar64._0_4_ = fVar105 * auVar45._0_4_;
  fVar114 = auVar54._4_4_;
  auVar64._4_4_ = fVar114 * auVar45._4_4_;
  fVar236 = auVar54._8_4_;
  auVar64._8_4_ = fVar236 * auVar45._8_4_;
  fVar220 = auVar54._12_4_;
  auVar64._12_4_ = fVar220 * auVar45._12_4_;
  auVar47._0_4_ = auVar48._0_4_ * fVar105;
  auVar47._4_4_ = auVar48._4_4_ * fVar114;
  auVar47._8_4_ = auVar48._8_4_ * fVar236;
  auVar47._12_4_ = auVar48._12_4_ * fVar220;
  auVar40._0_4_ = auVar52._0_4_ * fVar105;
  auVar40._4_4_ = auVar52._4_4_ * fVar114;
  auVar40._8_4_ = auVar52._8_4_ * fVar236;
  auVar40._12_4_ = auVar52._12_4_ * fVar220;
  auVar54 = vfmadd231ps_fma(auVar64,auVar53,auVar37);
  auVar55 = vfmadd231ps_fma(auVar47,auVar53,auVar51);
  auVar53 = vfmadd231ps_fma(auVar40,auVar50,auVar53);
  auVar56 = vfmadd231ps_fma(auVar54,auVar151,auVar36);
  auVar55 = vfmadd231ps_fma(auVar55,auVar151,auVar44);
  auVar57 = vfmadd231ps_fma(auVar53,auVar49,auVar151);
  auVar252._4_4_ = auVar59._0_4_;
  auVar252._0_4_ = auVar59._0_4_;
  auVar252._8_4_ = auVar59._0_4_;
  auVar252._12_4_ = auVar59._0_4_;
  auVar53 = vshufps_avx(auVar59,auVar59,0x55);
  auVar54 = vshufps_avx(auVar59,auVar59,0xaa);
  fVar105 = auVar54._0_4_;
  auVar152._0_4_ = fVar105 * auVar45._0_4_;
  fVar114 = auVar54._4_4_;
  auVar152._4_4_ = fVar114 * auVar45._4_4_;
  fVar236 = auVar54._8_4_;
  auVar152._8_4_ = fVar236 * auVar45._8_4_;
  fVar220 = auVar54._12_4_;
  auVar152._12_4_ = fVar220 * auVar45._12_4_;
  auVar62._0_4_ = auVar48._0_4_ * fVar105;
  auVar62._4_4_ = auVar48._4_4_ * fVar114;
  auVar62._8_4_ = auVar48._8_4_ * fVar236;
  auVar62._12_4_ = auVar48._12_4_ * fVar220;
  auVar61._0_4_ = auVar52._0_4_ * fVar105;
  auVar61._4_4_ = auVar52._4_4_ * fVar114;
  auVar61._8_4_ = auVar52._8_4_ * fVar236;
  auVar61._12_4_ = auVar52._12_4_ * fVar220;
  auVar37 = vfmadd231ps_fma(auVar152,auVar53,auVar37);
  auVar45 = vfmadd231ps_fma(auVar62,auVar53,auVar51);
  auVar51 = vfmadd231ps_fma(auVar61,auVar53,auVar50);
  auVar38 = vfmadd231ps_fma(auVar37,auVar252,auVar36);
  auVar39 = vfmadd231ps_fma(auVar45,auVar252,auVar44);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar271 = ZEXT1664(auVar36);
  auVar40 = vfmadd231ps_fma(auVar51,auVar252,auVar49);
  auVar37 = vandps_avx512vl(auVar56,auVar36);
  auVar182._8_4_ = 0x219392ef;
  auVar182._0_8_ = 0x219392ef219392ef;
  auVar182._12_4_ = 0x219392ef;
  uVar35 = vcmpps_avx512vl(auVar37,auVar182,1);
  bVar29 = (bool)((byte)uVar35 & 1);
  auVar41._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar56._0_4_;
  bVar29 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar41._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar56._4_4_;
  bVar29 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar41._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar56._8_4_;
  bVar29 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar41._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar56._12_4_;
  auVar37 = vandps_avx512vl(auVar55,auVar36);
  uVar35 = vcmpps_avx512vl(auVar37,auVar182,1);
  bVar29 = (bool)((byte)uVar35 & 1);
  auVar42._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar55._0_4_;
  bVar29 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar42._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar55._4_4_;
  bVar29 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar42._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar55._8_4_;
  bVar29 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar42._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar55._12_4_;
  auVar36 = vandps_avx512vl(auVar57,auVar36);
  uVar35 = vcmpps_avx512vl(auVar36,auVar182,1);
  bVar29 = (bool)((byte)uVar35 & 1);
  auVar43._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar57._0_4_;
  bVar29 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar43._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar57._4_4_;
  bVar29 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar43._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar57._8_4_;
  bVar29 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar43._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar57._12_4_;
  auVar37 = vrcp14ps_avx512vl(auVar41);
  auVar183._8_4_ = 0x3f800000;
  auVar183._0_8_ = 0x3f8000003f800000;
  auVar183._12_4_ = 0x3f800000;
  auVar36 = vfnmadd213ps_fma(auVar41,auVar37,auVar183);
  auVar56 = vfmadd132ps_fma(auVar36,auVar37,auVar37);
  auVar37 = vrcp14ps_avx512vl(auVar42);
  auVar36 = vfnmadd213ps_fma(auVar42,auVar37,auVar183);
  auVar57 = vfmadd132ps_fma(auVar36,auVar37,auVar37);
  auVar37 = vrcp14ps_avx512vl(auVar43);
  auVar36 = vfnmadd213ps_fma(auVar43,auVar37,auVar183);
  auVar16 = vfmadd132ps_fma(auVar36,auVar37,auVar37);
  fVar105 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar25 + 0x16)) *
            *(float *)(prim + lVar25 + 0x1a);
  auVar169._4_4_ = fVar105;
  auVar169._0_4_ = fVar105;
  auVar169._8_4_ = fVar105;
  auVar169._12_4_ = fVar105;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar23 * 7 + 6);
  auVar36 = vpmovsxwd_avx(auVar36);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar23 * 0xb + 6);
  auVar37 = vpmovsxwd_avx(auVar37);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar44 = vsubps_avx(auVar37,auVar36);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar23 * 9 + 6);
  auVar37 = vpmovsxwd_avx(auVar45);
  auVar45 = vfmadd213ps_fma(auVar44,auVar169,auVar36);
  auVar36 = vcvtdq2ps_avx(auVar37);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar23 * 0xd + 6);
  auVar37 = vpmovsxwd_avx(auVar44);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar37 = vsubps_avx(auVar37,auVar36);
  auVar44 = vfmadd213ps_fma(auVar37,auVar169,auVar36);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar23 * 0x12 + 6);
  auVar36 = vpmovsxwd_avx(auVar51);
  auVar36 = vcvtdq2ps_avx(auVar36);
  uVar35 = (ulong)(uint)((int)(uVar23 * 5) << 2);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar23 * 2 + uVar35 + 6);
  auVar37 = vpmovsxwd_avx(auVar48);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar37 = vsubps_avx(auVar37,auVar36);
  auVar51 = vfmadd213ps_fma(auVar37,auVar169,auVar36);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar35 + 6);
  auVar36 = vpmovsxwd_avx(auVar49);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar23 * 0x18 + 6);
  auVar37 = vpmovsxwd_avx(auVar50);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar37 = vsubps_avx(auVar37,auVar36);
  auVar48 = vfmadd213ps_fma(auVar37,auVar169,auVar36);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar23 * 0x1d + 6);
  auVar36 = vpmovsxwd_avx(auVar52);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar23 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar37 = vpmovsxwd_avx(auVar53);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar37 = vsubps_avx(auVar37,auVar36);
  auVar49 = vfmadd213ps_fma(auVar37,auVar169,auVar36);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar23) + 6);
  auVar36 = vpmovsxwd_avx(auVar54);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar23 * 0x23 + 6);
  auVar37 = vpmovsxwd_avx(auVar55);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar37 = vsubps_avx(auVar37,auVar36);
  auVar37 = vfmadd213ps_fma(auVar37,auVar169,auVar36);
  auVar36 = vsubps_avx(auVar45,auVar38);
  auVar170._0_4_ = auVar56._0_4_ * auVar36._0_4_;
  auVar170._4_4_ = auVar56._4_4_ * auVar36._4_4_;
  auVar170._8_4_ = auVar56._8_4_ * auVar36._8_4_;
  auVar170._12_4_ = auVar56._12_4_ * auVar36._12_4_;
  auVar36 = vsubps_avx(auVar44,auVar38);
  auVar58._0_4_ = auVar56._0_4_ * auVar36._0_4_;
  auVar58._4_4_ = auVar56._4_4_ * auVar36._4_4_;
  auVar58._8_4_ = auVar56._8_4_ * auVar36._8_4_;
  auVar58._12_4_ = auVar56._12_4_ * auVar36._12_4_;
  auVar36 = vsubps_avx(auVar51,auVar39);
  auVar153._0_4_ = auVar57._0_4_ * auVar36._0_4_;
  auVar153._4_4_ = auVar57._4_4_ * auVar36._4_4_;
  auVar153._8_4_ = auVar57._8_4_ * auVar36._8_4_;
  auVar153._12_4_ = auVar57._12_4_ * auVar36._12_4_;
  auVar36 = vsubps_avx(auVar48,auVar39);
  auVar60._0_4_ = auVar57._0_4_ * auVar36._0_4_;
  auVar60._4_4_ = auVar57._4_4_ * auVar36._4_4_;
  auVar60._8_4_ = auVar57._8_4_ * auVar36._8_4_;
  auVar60._12_4_ = auVar57._12_4_ * auVar36._12_4_;
  auVar36 = vsubps_avx(auVar49,auVar40);
  auVar63._0_4_ = auVar16._0_4_ * auVar36._0_4_;
  auVar63._4_4_ = auVar16._4_4_ * auVar36._4_4_;
  auVar63._8_4_ = auVar16._8_4_ * auVar36._8_4_;
  auVar63._12_4_ = auVar16._12_4_ * auVar36._12_4_;
  auVar36 = vsubps_avx(auVar37,auVar40);
  auVar46._0_4_ = auVar16._0_4_ * auVar36._0_4_;
  auVar46._4_4_ = auVar16._4_4_ * auVar36._4_4_;
  auVar46._8_4_ = auVar16._8_4_ * auVar36._8_4_;
  auVar46._12_4_ = auVar16._12_4_ * auVar36._12_4_;
  auVar36 = vpminsd_avx(auVar170,auVar58);
  auVar37 = vpminsd_avx(auVar153,auVar60);
  auVar36 = vmaxps_avx(auVar36,auVar37);
  auVar37 = vpminsd_avx(auVar63,auVar46);
  uVar106 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar56._4_4_ = uVar106;
  auVar56._0_4_ = uVar106;
  auVar56._8_4_ = uVar106;
  auVar56._12_4_ = uVar106;
  auVar37 = vmaxps_avx512vl(auVar37,auVar56);
  auVar36 = vmaxps_avx(auVar36,auVar37);
  auVar57._8_4_ = 0x3f7ffffa;
  auVar57._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar57._12_4_ = 0x3f7ffffa;
  local_580 = vmulps_avx512vl(auVar36,auVar57);
  auVar36 = vpmaxsd_avx(auVar170,auVar58);
  auVar37 = vpmaxsd_avx(auVar153,auVar60);
  auVar36 = vminps_avx(auVar36,auVar37);
  auVar37 = vpmaxsd_avx(auVar63,auVar46);
  uVar106 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar16._4_4_ = uVar106;
  auVar16._0_4_ = uVar106;
  auVar16._8_4_ = uVar106;
  auVar16._12_4_ = uVar106;
  auVar37 = vminps_avx512vl(auVar37,auVar16);
  auVar36 = vminps_avx(auVar36,auVar37);
  auVar38._8_4_ = 0x3f800003;
  auVar38._0_8_ = 0x3f8000033f800003;
  auVar38._12_4_ = 0x3f800003;
  auVar36 = vmulps_avx512vl(auVar36,auVar38);
  auVar37 = vpbroadcastd_avx512vl();
  uVar14 = vcmpps_avx512vl(local_580,auVar36,2);
  uVar35 = vpcmpgtd_avx512vl(auVar37,_DAT_01f7fcf0);
  uVar35 = ((byte)uVar14 & 0xf) & uVar35;
  if ((char)uVar35 == '\0') {
    return false;
  }
  auVar113 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar113);
  auVar36 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar113 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar270 = ZEXT1664(auVar36);
LAB_01b96b2d:
  lVar25 = 0;
  for (uVar23 = uVar35; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
    lVar25 = lVar25 + 1;
  }
  uVar30 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar30].ptr;
  fVar105 = (pGVar8->time_range).lower;
  fVar105 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x1c0) - fVar105) / ((pGVar8->time_range).upper - fVar105));
  auVar36 = vroundss_avx(ZEXT416((uint)fVar105),ZEXT416((uint)fVar105),9);
  auVar37 = vaddss_avx512f(ZEXT416((uint)pGVar8->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar36 = vminss_avx(auVar36,auVar37);
  auVar42 = auVar113._0_16_;
  auVar38 = vmaxss_avx512f(auVar42,auVar36);
  uVar23 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(prim + lVar25 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar27 = (long)(int)auVar38._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar27);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar27);
  auVar36 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar23);
  lVar25 = uVar23 + 1;
  auVar37 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar25);
  lVar1 = uVar23 + 2;
  auVar45 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar23 + 3;
  auVar44 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar27);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar27);
  auVar51 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar23);
  auVar48 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar25);
  auVar49 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar50 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar27);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar27);
  auVar52 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar23);
  auVar53 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar25);
  auVar54 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  auVar55 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar2);
  auVar113 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar113);
  lVar11 = *(long *)(lVar10 + 0x38 + lVar27);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar27);
  auVar56 = *(undefined1 (*) [16])(lVar11 + uVar23 * lVar10);
  auVar103 = auVar113._16_48_;
  auVar57 = *(undefined1 (*) [16])(lVar11 + lVar25 * lVar10);
  auVar16 = *(undefined1 (*) [16])(lVar11 + lVar1 * lVar10);
  auVar38 = vsubss_avx512f(ZEXT416((uint)fVar105),auVar38);
  auVar272._0_16_ = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
  auVar39 = vmulps_avx512vl(auVar44,auVar272._0_16_);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar45,auVar272._0_16_);
  auVar40 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar40 = vfmadd213ps_avx512vl(auVar40,auVar37,auVar39);
  auVar40 = vaddps_avx512vl(auVar36,auVar40);
  auVar60 = auVar270._0_16_;
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar37,auVar60);
  auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar36,auVar60);
  auVar41 = vmulps_avx512vl(auVar50,auVar272._0_16_);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar49,auVar272._0_16_);
  auVar42 = vxorps_avx512vl(auVar42,auVar42);
  auVar42 = vfmadd213ps_avx512vl(auVar42,auVar48,auVar41);
  auVar43 = vaddps_avx512vl(auVar51,auVar42);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar48,auVar60);
  auVar41 = vfnmadd231ps_avx512vl(auVar41,auVar51,auVar60);
  auVar42 = vxorps_avx512vl(auVar42,auVar42);
  auVar42 = vfmadd213ps_avx512vl(auVar42,auVar45,auVar44);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar37,auVar272._0_16_);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar36,auVar272._0_16_);
  auVar44 = vmulps_avx512vl(auVar44,auVar60);
  auVar45 = vfnmadd231ps_avx512vl(auVar44,auVar60,auVar45);
  auVar37 = vfmadd231ps_avx512vl(auVar45,auVar272._0_16_,auVar37);
  auVar46 = vfnmadd231ps_avx512vl(auVar37,auVar272._0_16_,auVar36);
  auVar36 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar49,auVar50);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar48,auVar272._0_16_);
  auVar47 = vfmadd231ps_avx512vl(auVar36,auVar51,auVar272._0_16_);
  auVar36 = vmulps_avx512vl(auVar50,auVar60);
  auVar36 = vfnmadd231ps_avx512vl(auVar36,auVar60,auVar49);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar272._0_16_,auVar48);
  auVar48 = vfnmadd231ps_avx512vl(auVar36,auVar272._0_16_,auVar51);
  auVar36 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar37 = vshufps_avx512vl(auVar43,auVar43,0xc9);
  fVar129 = auVar39._0_4_;
  auVar154._0_4_ = fVar129 * auVar37._0_4_;
  fVar141 = auVar39._4_4_;
  auVar154._4_4_ = fVar141 * auVar37._4_4_;
  fVar142 = auVar39._8_4_;
  auVar154._8_4_ = fVar142 * auVar37._8_4_;
  fVar143 = auVar39._12_4_;
  auVar154._12_4_ = fVar143 * auVar37._12_4_;
  auVar37 = vfmsub231ps_avx512vl(auVar154,auVar36,auVar43);
  auVar45 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vshufps_avx512vl(auVar41,auVar41,0xc9);
  auVar171._0_4_ = fVar129 * auVar37._0_4_;
  auVar171._4_4_ = fVar141 * auVar37._4_4_;
  auVar171._8_4_ = fVar142 * auVar37._8_4_;
  auVar171._12_4_ = fVar143 * auVar37._12_4_;
  auVar36 = vfmsub231ps_avx512vl(auVar171,auVar36,auVar41);
  auVar44 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar37 = vshufps_avx(auVar47,auVar47,0xc9);
  fVar105 = auVar46._0_4_;
  auVar194._0_4_ = auVar37._0_4_ * fVar105;
  fVar114 = auVar46._4_4_;
  auVar194._4_4_ = auVar37._4_4_ * fVar114;
  fVar236 = auVar46._8_4_;
  auVar194._8_4_ = auVar37._8_4_ * fVar236;
  fVar220 = auVar46._12_4_;
  auVar194._12_4_ = auVar37._12_4_ * fVar220;
  auVar37 = vfmsub231ps_fma(auVar194,auVar36,auVar47);
  auVar51 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar195._0_4_ = auVar37._0_4_ * fVar105;
  auVar195._4_4_ = auVar37._4_4_ * fVar114;
  auVar195._8_4_ = auVar37._8_4_ * fVar236;
  auVar195._12_4_ = auVar37._12_4_ * fVar220;
  auVar36 = vfmsub231ps_fma(auVar195,auVar36,auVar48);
  auVar48 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vdpps_avx(auVar45,auVar45,0x7f);
  auVar272._16_48_ = auVar103;
  auVar113._4_60_ = auVar272._4_60_;
  auVar113._0_4_ = auVar36._0_4_;
  auVar37 = vrsqrt14ss_avx512f(auVar272._0_16_,auVar113._0_16_);
  auVar49 = vmulss_avx512f(auVar37,ZEXT416(0x3fc00000));
  auVar50 = vmulss_avx512f(auVar36,ZEXT416(0x3f000000));
  auVar50 = vmulss_avx512f(auVar50,auVar37);
  auVar37 = vmulss_avx512f(auVar50,ZEXT416((uint)(auVar37._0_4_ * auVar37._0_4_)));
  auVar37 = vsubss_avx512f(auVar49,auVar37);
  auVar203._0_4_ = auVar37._0_4_;
  auVar203._4_4_ = auVar203._0_4_;
  auVar203._8_4_ = auVar203._0_4_;
  auVar203._12_4_ = auVar203._0_4_;
  auVar49 = vmulps_avx512vl(auVar45,auVar203);
  auVar37 = vdpps_avx(auVar45,auVar44,0x7f);
  auVar50 = vbroadcastss_avx512vl(auVar36);
  auVar44 = vmulps_avx512vl(auVar50,auVar44);
  fVar231 = auVar37._0_4_;
  auVar155._0_4_ = fVar231 * auVar45._0_4_;
  auVar155._4_4_ = fVar231 * auVar45._4_4_;
  auVar155._8_4_ = fVar231 * auVar45._8_4_;
  auVar155._12_4_ = fVar231 * auVar45._12_4_;
  auVar45 = vsubps_avx(auVar44,auVar155);
  auVar37 = vrcp14ss_avx512f(auVar272._0_16_,auVar113._0_16_);
  auVar36 = vfnmadd213ss_avx512f(auVar36,auVar37,ZEXT416(0x40000000));
  fVar231 = auVar37._0_4_ * auVar36._0_4_;
  auVar36 = vdpps_avx(auVar51,auVar51,0x7f);
  auVar270._16_48_ = auVar103;
  auVar270._0_16_ = auVar272._0_16_;
  auVar267._4_60_ = auVar270._4_60_;
  auVar267._0_4_ = auVar36._0_4_;
  auVar37 = vrsqrt14ss_avx512f(auVar272._0_16_,auVar267._0_16_);
  auVar44 = vmulss_avx512f(auVar37,ZEXT416(0x3fc00000));
  auVar50 = vmulss_avx512f(auVar36,ZEXT416(0x3f000000));
  fVar232 = auVar37._0_4_;
  fVar144 = auVar44._0_4_ - auVar50._0_4_ * fVar232 * fVar232 * fVar232;
  auVar204._0_4_ = fVar144 * auVar51._0_4_;
  auVar204._4_4_ = fVar144 * auVar51._4_4_;
  auVar204._8_4_ = fVar144 * auVar51._8_4_;
  auVar204._12_4_ = fVar144 * auVar51._12_4_;
  auVar37 = vdpps_avx(auVar51,auVar48,0x7f);
  auVar44 = vbroadcastss_avx512vl(auVar36);
  auVar44 = vmulps_avx512vl(auVar44,auVar48);
  fVar232 = auVar37._0_4_;
  auVar107._0_4_ = fVar232 * auVar51._0_4_;
  auVar107._4_4_ = fVar232 * auVar51._4_4_;
  auVar107._8_4_ = fVar232 * auVar51._8_4_;
  auVar107._12_4_ = fVar232 * auVar51._12_4_;
  auVar37 = vsubps_avx(auVar44,auVar107);
  auVar44 = vrcp14ss_avx512f(auVar272._0_16_,auVar267._0_16_);
  auVar36 = vfnmadd213ss_avx512f(auVar36,auVar44,ZEXT416(0x40000000));
  fVar232 = auVar44._0_4_ * auVar36._0_4_;
  auVar44 = vshufps_avx512vl(auVar40,auVar40,0xff);
  auVar51 = vmulps_avx512vl(auVar44,auVar49);
  auVar48 = vsubps_avx512vl(auVar40,auVar51);
  auVar36 = vshufps_avx(auVar39,auVar39,0xff);
  auVar36 = vmulps_avx512vl(auVar36,auVar49);
  auVar145._0_4_ = auVar36._0_4_ + auVar44._0_4_ * auVar203._0_4_ * fVar231 * auVar45._0_4_;
  auVar145._4_4_ = auVar36._4_4_ + auVar44._4_4_ * auVar203._0_4_ * fVar231 * auVar45._4_4_;
  auVar145._8_4_ = auVar36._8_4_ + auVar44._8_4_ * auVar203._0_4_ * fVar231 * auVar45._8_4_;
  auVar145._12_4_ = auVar36._12_4_ + auVar44._12_4_ * auVar203._0_4_ * fVar231 * auVar45._12_4_;
  auVar36 = vsubps_avx(auVar39,auVar145);
  auVar49 = vaddps_avx512vl(auVar40,auVar51);
  auVar45 = vshufps_avx512vl(auVar42,auVar42,0xff);
  auVar238._0_4_ = auVar204._0_4_ * auVar45._0_4_;
  auVar238._4_4_ = auVar204._4_4_ * auVar45._4_4_;
  auVar238._8_4_ = auVar204._8_4_ * auVar45._8_4_;
  auVar238._12_4_ = auVar204._12_4_ * auVar45._12_4_;
  auVar50 = vsubps_avx512vl(auVar42,auVar238);
  auVar44 = vshufps_avx512vl(auVar46,auVar46,0xff);
  auVar51 = vmulps_avx512vl(auVar44,auVar204);
  auVar156._0_4_ = auVar51._0_4_ + auVar45._0_4_ * fVar144 * auVar37._0_4_ * fVar232;
  auVar156._4_4_ = auVar51._4_4_ + auVar45._4_4_ * fVar144 * auVar37._4_4_ * fVar232;
  auVar156._8_4_ = auVar51._8_4_ + auVar45._8_4_ * fVar144 * auVar37._8_4_ * fVar232;
  auVar156._12_4_ = auVar51._12_4_ + auVar45._12_4_ * fVar144 * auVar37._12_4_ * fVar232;
  auVar37 = vsubps_avx(auVar46,auVar156);
  auVar39 = vaddps_avx512vl(auVar42,auVar238);
  auVar184._0_4_ = auVar48._0_4_ + auVar36._0_4_ * 0.33333334;
  auVar184._4_4_ = auVar48._4_4_ + auVar36._4_4_ * 0.33333334;
  auVar184._8_4_ = auVar48._8_4_ + auVar36._8_4_ * 0.33333334;
  auVar184._12_4_ = auVar48._12_4_ + auVar36._12_4_ * 0.33333334;
  auVar157._0_4_ = auVar37._0_4_ * 0.33333334;
  auVar157._4_4_ = auVar37._4_4_ * 0.33333334;
  auVar157._8_4_ = auVar37._8_4_ * 0.33333334;
  auVar157._12_4_ = auVar37._12_4_ * 0.33333334;
  auVar51 = vsubps_avx(auVar50,auVar157);
  auVar158._0_4_ = (fVar129 + auVar145._0_4_) * 0.33333334;
  auVar158._4_4_ = (fVar141 + auVar145._4_4_) * 0.33333334;
  auVar158._8_4_ = (fVar142 + auVar145._8_4_) * 0.33333334;
  auVar158._12_4_ = (fVar143 + auVar145._12_4_) * 0.33333334;
  auVar40 = vaddps_avx512vl(auVar49,auVar158);
  auVar172._0_4_ = (fVar105 + auVar156._0_4_) * 0.33333334;
  auVar172._4_4_ = (fVar114 + auVar156._4_4_) * 0.33333334;
  auVar172._8_4_ = (fVar236 + auVar156._8_4_) * 0.33333334;
  auVar172._12_4_ = (fVar220 + auVar156._12_4_) * 0.33333334;
  auVar41 = vsubps_avx512vl(auVar39,auVar172);
  auVar36 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar2);
  auVar37 = vmulps_avx512vl(auVar55,auVar272._0_16_);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar54,auVar272._0_16_);
  auVar45 = vxorps_avx512vl(auVar44,auVar44);
  auVar45 = vfmadd213ps_avx512vl(auVar45,auVar53,auVar37);
  auVar43 = vaddps_avx512vl(auVar52,auVar45);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar53,auVar60);
  auVar46 = vfnmadd231ps_avx512vl(auVar37,auVar52,auVar60);
  auVar37 = vmulps_avx512vl(auVar36,auVar272._0_16_);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar16,auVar272._0_16_);
  auVar45 = vxorps_avx512vl(auVar42,auVar42);
  auVar45 = vfmadd213ps_avx512vl(auVar45,auVar57,auVar37);
  auVar44 = vaddps_avx512vl(auVar56,auVar45);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar57,auVar60);
  auVar37 = vfnmadd231ps_avx512vl(auVar37,auVar56,auVar60);
  auVar45 = vxorps_avx512vl(auVar45,auVar45);
  auVar45 = vfmadd213ps_avx512vl(auVar45,auVar54,auVar55);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar53,auVar272._0_16_);
  auVar42 = vfmadd231ps_avx512vl(auVar45,auVar52,auVar272._0_16_);
  auVar45 = vmulps_avx512vl(auVar55,auVar60);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar60,auVar54);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar272._0_16_,auVar53);
  auVar52 = vfnmadd231ps_avx512vl(auVar45,auVar272._0_16_,auVar52);
  auVar45 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar16,auVar36);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar57,auVar272._0_16_);
  auVar53 = vfmadd231ps_avx512vl(auVar45,auVar56,auVar272._0_16_);
  auVar36 = vmulps_avx512vl(auVar36,auVar60);
  auVar36 = vfnmadd231ps_avx512vl(auVar36,auVar60,auVar16);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar272._0_16_,auVar57);
  auVar54 = vfnmadd231ps_avx512vl(auVar36,auVar272._0_16_,auVar56);
  auVar36 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar45 = vshufps_avx512vl(auVar44,auVar44,0xc9);
  fVar236 = auVar46._0_4_;
  auVar253._0_4_ = fVar236 * auVar45._0_4_;
  fVar220 = auVar46._4_4_;
  auVar253._4_4_ = fVar220 * auVar45._4_4_;
  fVar231 = auVar46._8_4_;
  auVar253._8_4_ = fVar231 * auVar45._8_4_;
  fVar232 = auVar46._12_4_;
  auVar253._12_4_ = fVar232 * auVar45._12_4_;
  auVar45 = vfmsub231ps_avx512vl(auVar253,auVar36,auVar44);
  auVar45 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar44 = vshufps_avx512vl(auVar37,auVar37,0xc9);
  auVar259._0_4_ = fVar236 * auVar44._0_4_;
  auVar259._4_4_ = fVar220 * auVar44._4_4_;
  auVar259._8_4_ = fVar231 * auVar44._8_4_;
  auVar259._12_4_ = fVar232 * auVar44._12_4_;
  auVar36 = vfmsub231ps_avx512vl(auVar259,auVar36,auVar37);
  auVar44 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar37 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar36 = vshufps_avx512vl(auVar53,auVar53,0xc9);
  auVar36 = vmulps_avx512vl(auVar52,auVar36);
  auVar36 = vfmsub231ps_avx512vl(auVar36,auVar37,auVar53);
  auVar53 = vshufps_avx512vl(auVar36,auVar36,0xc9);
  auVar55 = vshufps_avx512vl(auVar54,auVar54,0xc9);
  auVar36 = vdpps_avx(auVar45,auVar45,0x7f);
  auVar55 = vmulps_avx512vl(auVar52,auVar55);
  auVar37 = vfmsub231ps_avx512vl(auVar55,auVar37,auVar54);
  auVar54 = vshufps_avx512vl(auVar37,auVar37,0xc9);
  auVar269._16_48_ = auVar103;
  auVar269._0_16_ = auVar272._0_16_;
  auVar268._4_60_ = auVar269._4_60_;
  auVar268._0_4_ = auVar36._0_4_;
  auVar37 = vrsqrt14ss_avx512f(auVar272._0_16_,auVar268._0_16_);
  auVar55 = vmulss_avx512f(auVar37,ZEXT416(0x3fc00000));
  auVar56 = vmulss_avx512f(auVar36,ZEXT416(0x3f000000));
  auVar56 = vmulss_avx512f(auVar56,auVar37);
  auVar37 = vmulss_avx512f(auVar37,auVar37);
  auVar37 = vmulss_avx512f(auVar56,auVar37);
  auVar37 = vsubss_avx512f(auVar55,auVar37);
  auVar55 = vbroadcastss_avx512vl(auVar37);
  auVar56 = vmulps_avx512vl(auVar45,auVar55);
  auVar37 = vdpps_avx(auVar45,auVar44,0x7f);
  auVar57 = vbroadcastss_avx512vl(auVar36);
  auVar44 = vmulps_avx512vl(auVar57,auVar44);
  fVar105 = auVar37._0_4_;
  auVar159._0_4_ = auVar45._0_4_ * fVar105;
  auVar159._4_4_ = auVar45._4_4_ * fVar105;
  auVar159._8_4_ = auVar45._8_4_ * fVar105;
  auVar159._12_4_ = auVar45._12_4_ * fVar105;
  auVar37 = vsubps_avx(auVar44,auVar159);
  auVar45 = vrcp14ss_avx512f(auVar272._0_16_,auVar268._0_16_);
  auVar36 = vfnmadd213ss_avx512f(auVar36,auVar45,ZEXT416(0x40000000));
  fVar105 = auVar45._0_4_ * auVar36._0_4_;
  auVar36 = vdpps_avx(auVar53,auVar53,0x7f);
  auVar115._0_4_ = fVar105 * auVar37._0_4_;
  auVar115._4_4_ = fVar105 * auVar37._4_4_;
  auVar115._8_4_ = fVar105 * auVar37._8_4_;
  auVar115._12_4_ = fVar105 * auVar37._12_4_;
  auVar45 = vmulps_avx512vl(auVar55,auVar115);
  auVar273._16_48_ = auVar103;
  auVar273._0_16_ = auVar272._0_16_;
  auVar101._4_60_ = auVar273._4_60_;
  auVar101._0_4_ = auVar36._0_4_;
  auVar37 = vrsqrt14ss_avx512f(auVar272._0_16_,auVar101._0_16_);
  auVar44 = vmulss_avx512f(auVar37,ZEXT416(0x3fc00000));
  auVar55 = vmulss_avx512f(auVar36,ZEXT416(0x3f000000));
  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar55 = vmulss_avx512f(auVar55,auVar37);
  auVar37 = vmulss_avx512f(auVar55,ZEXT416((uint)(auVar37._0_4_ * auVar37._0_4_)));
  fVar114 = auVar44._0_4_ - auVar37._0_4_;
  auVar260._0_4_ = auVar53._0_4_ * fVar114;
  auVar260._4_4_ = auVar53._4_4_ * fVar114;
  auVar260._8_4_ = auVar53._8_4_ * fVar114;
  auVar260._12_4_ = auVar53._12_4_ * fVar114;
  auVar37 = vdpps_avx(auVar53,auVar54,0x7f);
  auVar44 = vbroadcastss_avx512vl(auVar36);
  auVar44 = vmulps_avx512vl(auVar44,auVar54);
  fVar105 = auVar37._0_4_;
  auVar173._0_4_ = auVar53._0_4_ * fVar105;
  auVar173._4_4_ = auVar53._4_4_ * fVar105;
  auVar173._8_4_ = auVar53._8_4_ * fVar105;
  auVar173._12_4_ = auVar53._12_4_ * fVar105;
  auVar37 = vsubps_avx(auVar44,auVar173);
  auVar44 = vrcp14ss_avx512f(auVar272._0_16_,auVar101._0_16_);
  auVar36 = vfnmadd213ss_avx512f(auVar36,auVar44,ZEXT416(0x40000000));
  auVar272 = ZEXT464(0x3f800000);
  fVar105 = auVar36._0_4_ * auVar44._0_4_;
  auVar44 = vshufps_avx512vl(auVar43,auVar43,0xff);
  auVar53 = vmulps_avx512vl(auVar44,auVar56);
  auVar54 = vsubps_avx512vl(auVar43,auVar53);
  auVar36 = vshufps_avx(auVar46,auVar46,0xff);
  auVar36 = vmulps_avx512vl(auVar36,auVar56);
  auVar116._0_4_ = auVar36._0_4_ + auVar44._0_4_ * auVar45._0_4_;
  auVar116._4_4_ = auVar36._4_4_ + auVar44._4_4_ * auVar45._4_4_;
  auVar116._8_4_ = auVar36._8_4_ + auVar44._8_4_ * auVar45._8_4_;
  auVar116._12_4_ = auVar36._12_4_ + auVar44._12_4_ * auVar45._12_4_;
  auVar36 = vsubps_avx(auVar46,auVar116);
  auVar45 = vaddps_avx512vl(auVar43,auVar53);
  auVar44 = vshufps_avx512vl(auVar42,auVar42,0xff);
  auVar239._0_4_ = auVar44._0_4_ * auVar260._0_4_;
  auVar239._4_4_ = auVar44._4_4_ * auVar260._4_4_;
  auVar239._8_4_ = auVar44._8_4_ * auVar260._8_4_;
  auVar239._12_4_ = auVar44._12_4_ * auVar260._12_4_;
  auVar53 = vsubps_avx512vl(auVar42,auVar239);
  auVar55 = vshufps_avx512vl(auVar52,auVar52,0xff);
  auVar55 = vmulps_avx512vl(auVar55,auVar260);
  auVar160._0_4_ = auVar55._0_4_ + auVar44._0_4_ * fVar114 * auVar37._0_4_ * fVar105;
  auVar160._4_4_ = auVar55._4_4_ + auVar44._4_4_ * fVar114 * auVar37._4_4_ * fVar105;
  auVar160._8_4_ = auVar55._8_4_ + auVar44._8_4_ * fVar114 * auVar37._8_4_ * fVar105;
  auVar160._12_4_ = auVar55._12_4_ + auVar44._12_4_ * fVar114 * auVar37._12_4_ * fVar105;
  auVar37 = vsubps_avx(auVar52,auVar160);
  auVar44 = vaddps_avx512vl(auVar42,auVar239);
  auVar174._0_4_ = auVar54._0_4_ + auVar36._0_4_ * 0.33333334;
  auVar174._4_4_ = auVar54._4_4_ + auVar36._4_4_ * 0.33333334;
  auVar174._8_4_ = auVar54._8_4_ + auVar36._8_4_ * 0.33333334;
  auVar174._12_4_ = auVar54._12_4_ + auVar36._12_4_ * 0.33333334;
  auVar205._0_4_ = auVar37._0_4_ * 0.33333334;
  auVar205._4_4_ = auVar37._4_4_ * 0.33333334;
  auVar205._8_4_ = auVar37._8_4_ * 0.33333334;
  auVar205._12_4_ = auVar37._12_4_ * 0.33333334;
  auVar36 = vsubps_avx(auVar53,auVar205);
  auVar117._0_4_ = auVar45._0_4_ + (fVar236 + auVar116._0_4_) * 0.33333334;
  auVar117._4_4_ = auVar45._4_4_ + (fVar220 + auVar116._4_4_) * 0.33333334;
  auVar117._8_4_ = auVar45._8_4_ + (fVar231 + auVar116._8_4_) * 0.33333334;
  auVar117._12_4_ = auVar45._12_4_ + (fVar232 + auVar116._12_4_) * 0.33333334;
  auVar161._0_4_ = (auVar52._0_4_ + auVar160._0_4_) * 0.33333334;
  auVar161._4_4_ = (auVar52._4_4_ + auVar160._4_4_) * 0.33333334;
  auVar161._8_4_ = (auVar52._8_4_ + auVar160._8_4_) * 0.33333334;
  auVar161._12_4_ = (auVar52._12_4_ + auVar160._12_4_) * 0.33333334;
  auVar37 = vsubps_avx(auVar44,auVar161);
  auVar52 = vbroadcastss_avx512vl(auVar38);
  auVar55 = vsubss_avx512f(ZEXT416(0x3f800000),auVar38);
  auVar261._0_4_ = auVar55._0_4_;
  auVar261._4_4_ = auVar261._0_4_;
  auVar261._8_4_ = auVar261._0_4_;
  auVar261._12_4_ = auVar261._0_4_;
  auVar54 = vmulps_avx512vl(auVar52,auVar54);
  auVar55 = vmulps_avx512vl(auVar52,auVar174);
  auVar36 = vmulps_avx512vl(auVar52,auVar36);
  auVar254._0_4_ = auVar52._0_4_ * auVar53._0_4_;
  auVar254._4_4_ = auVar52._4_4_ * auVar53._4_4_;
  auVar254._8_4_ = auVar52._8_4_ * auVar53._8_4_;
  auVar254._12_4_ = auVar52._12_4_ * auVar53._12_4_;
  local_500 = vfmadd231ps_avx512vl(auVar54,auVar261,auVar48);
  local_510 = vfmadd231ps_avx512vl(auVar55,auVar261,auVar184);
  local_520 = vfmadd231ps_avx512vl(auVar36,auVar261,auVar51);
  local_530 = vfmadd231ps_fma(auVar254,auVar261,auVar50);
  auVar36 = vmulps_avx512vl(auVar52,auVar45);
  auVar45 = vmulps_avx512vl(auVar52,auVar117);
  auVar37 = vmulps_avx512vl(auVar52,auVar37);
  auVar248._0_4_ = auVar52._0_4_ * auVar44._0_4_;
  auVar248._4_4_ = auVar52._4_4_ * auVar44._4_4_;
  auVar248._8_4_ = auVar52._8_4_ * auVar44._8_4_;
  auVar248._12_4_ = auVar52._12_4_ * auVar44._12_4_;
  _local_540 = vfmadd231ps_avx512vl(auVar36,auVar261,auVar49);
  _local_550 = vfmadd231ps_avx512vl(auVar45,auVar261,auVar40);
  _local_560 = vfmadd231ps_avx512vl(auVar37,auVar261,auVar41);
  _local_570 = vfmadd231ps_fma(auVar248,auVar261,auVar39);
  auVar36 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  local_480 = vsubps_avx512vl(local_500,auVar36);
  uVar106 = local_480._0_4_;
  auVar118._4_4_ = uVar106;
  auVar118._0_4_ = uVar106;
  auVar118._8_4_ = uVar106;
  auVar118._12_4_ = uVar106;
  auVar37 = vshufps_avx(local_480,local_480,0x55);
  auVar45 = vshufps_avx(local_480,local_480,0xaa);
  aVar4 = pre->ray_space[k].vx.field_0;
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar105 = pre->ray_space[k].vz.field_0.m128[0];
  fVar114 = pre->ray_space[k].vz.field_0.m128[1];
  fVar236 = pre->ray_space[k].vz.field_0.m128[2];
  fVar220 = pre->ray_space[k].vz.field_0.m128[3];
  auVar108._0_4_ = fVar105 * auVar45._0_4_;
  auVar108._4_4_ = fVar114 * auVar45._4_4_;
  auVar108._8_4_ = fVar236 * auVar45._8_4_;
  auVar108._12_4_ = fVar220 * auVar45._12_4_;
  auVar37 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar5,auVar37);
  auVar50 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar4,auVar118);
  local_490 = vsubps_avx512vl(local_510,auVar36);
  uVar106 = local_490._0_4_;
  auVar130._4_4_ = uVar106;
  auVar130._0_4_ = uVar106;
  auVar130._8_4_ = uVar106;
  auVar130._12_4_ = uVar106;
  auVar37 = vshufps_avx(local_490,local_490,0x55);
  auVar45 = vshufps_avx(local_490,local_490,0xaa);
  auVar119._0_4_ = fVar105 * auVar45._0_4_;
  auVar119._4_4_ = fVar114 * auVar45._4_4_;
  auVar119._8_4_ = fVar236 * auVar45._8_4_;
  auVar119._12_4_ = fVar220 * auVar45._12_4_;
  auVar37 = vfmadd231ps_fma(auVar119,(undefined1  [16])aVar5,auVar37);
  auVar52 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar4,auVar130);
  local_4a0 = vsubps_avx512vl(local_520,auVar36);
  uVar106 = local_4a0._0_4_;
  auVar131._4_4_ = uVar106;
  auVar131._0_4_ = uVar106;
  auVar131._8_4_ = uVar106;
  auVar131._12_4_ = uVar106;
  auVar37 = vshufps_avx(local_4a0,local_4a0,0x55);
  auVar45 = vshufps_avx(local_4a0,local_4a0,0xaa);
  auVar196._0_4_ = auVar45._0_4_ * fVar105;
  auVar196._4_4_ = auVar45._4_4_ * fVar114;
  auVar196._8_4_ = auVar45._8_4_ * fVar236;
  auVar196._12_4_ = auVar45._12_4_ * fVar220;
  auVar37 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar5,auVar37);
  auVar53 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar4,auVar131);
  local_4b0 = vsubps_avx(local_530,auVar36);
  uVar106 = local_4b0._0_4_;
  auVar132._4_4_ = uVar106;
  auVar132._0_4_ = uVar106;
  auVar132._8_4_ = uVar106;
  auVar132._12_4_ = uVar106;
  auVar37 = vshufps_avx(local_4b0,local_4b0,0x55);
  auVar45 = vshufps_avx(local_4b0,local_4b0,0xaa);
  auVar206._0_4_ = auVar45._0_4_ * fVar105;
  auVar206._4_4_ = auVar45._4_4_ * fVar114;
  auVar206._8_4_ = auVar45._8_4_ * fVar236;
  auVar206._12_4_ = auVar45._12_4_ * fVar220;
  auVar37 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar5,auVar37);
  auVar54 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar4,auVar132);
  local_4c0 = vsubps_avx512vl(_local_540,auVar36);
  uVar106 = local_4c0._0_4_;
  auVar133._4_4_ = uVar106;
  auVar133._0_4_ = uVar106;
  auVar133._8_4_ = uVar106;
  auVar133._12_4_ = uVar106;
  auVar37 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar45 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar216._0_4_ = auVar45._0_4_ * fVar105;
  auVar216._4_4_ = auVar45._4_4_ * fVar114;
  auVar216._8_4_ = auVar45._8_4_ * fVar236;
  auVar216._12_4_ = auVar45._12_4_ * fVar220;
  auVar37 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar5,auVar37);
  auVar55 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar4,auVar133);
  local_4d0 = vsubps_avx512vl(_local_550,auVar36);
  uVar106 = local_4d0._0_4_;
  auVar134._4_4_ = uVar106;
  auVar134._0_4_ = uVar106;
  auVar134._8_4_ = uVar106;
  auVar134._12_4_ = uVar106;
  auVar37 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar45 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar221._0_4_ = auVar45._0_4_ * fVar105;
  auVar221._4_4_ = auVar45._4_4_ * fVar114;
  auVar221._8_4_ = auVar45._8_4_ * fVar236;
  auVar221._12_4_ = auVar45._12_4_ * fVar220;
  auVar37 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar5,auVar37);
  auVar56 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar4,auVar134);
  local_4e0 = vsubps_avx512vl(_local_560,auVar36);
  uVar106 = local_4e0._0_4_;
  auVar135._4_4_ = uVar106;
  auVar135._0_4_ = uVar106;
  auVar135._8_4_ = uVar106;
  auVar135._12_4_ = uVar106;
  auVar37 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar45 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar240._0_4_ = auVar45._0_4_ * fVar105;
  auVar240._4_4_ = auVar45._4_4_ * fVar114;
  auVar240._8_4_ = auVar45._8_4_ * fVar236;
  auVar240._12_4_ = auVar45._12_4_ * fVar220;
  auVar37 = vfmadd231ps_fma(auVar240,(undefined1  [16])aVar5,auVar37);
  auVar57 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar4,auVar135);
  local_4f0 = vsubps_avx(_local_570,auVar36);
  uVar106 = local_4f0._0_4_;
  auVar122._4_4_ = uVar106;
  auVar122._0_4_ = uVar106;
  auVar122._8_4_ = uVar106;
  auVar122._12_4_ = uVar106;
  auVar36 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar37 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar175._0_4_ = fVar105 * auVar37._0_4_;
  auVar175._4_4_ = fVar114 * auVar37._4_4_;
  auVar175._8_4_ = fVar236 * auVar37._8_4_;
  auVar175._12_4_ = fVar220 * auVar37._12_4_;
  auVar36 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar5,auVar36);
  auVar16 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar4,auVar122);
  auVar49 = vmovlhps_avx512f(auVar50,auVar55);
  auVar45 = vmovlhps_avx(auVar52,auVar56);
  auVar44 = vmovlhps_avx(auVar53,auVar57);
  auVar51 = vmovlhps_avx(auVar54,auVar16);
  auVar37 = vminps_avx512vl(auVar49,auVar45);
  auVar48 = vmaxps_avx512vl(auVar49,auVar45);
  auVar36 = vminps_avx(auVar44,auVar51);
  auVar37 = vminps_avx(auVar37,auVar36);
  auVar36 = vmaxps_avx(auVar44,auVar51);
  auVar36 = vmaxps_avx(auVar48,auVar36);
  auVar48 = vshufpd_avx(auVar37,auVar37,3);
  auVar37 = vminps_avx(auVar37,auVar48);
  auVar48 = vshufpd_avx(auVar36,auVar36,3);
  auVar36 = vmaxps_avx(auVar36,auVar48);
  auVar37 = vandps_avx512vl(auVar37,auVar271._0_16_);
  auVar36 = vandps_avx512vl(auVar36,auVar271._0_16_);
  auVar36 = vmaxps_avx(auVar37,auVar36);
  auVar37 = vmovshdup_avx(auVar36);
  auVar36 = vmaxss_avx(auVar37,auVar36);
  fVar114 = auVar36._0_4_ * 9.536743e-07;
  auVar37 = vmovddup_avx512vl(auVar50);
  auVar48 = vmovddup_avx512vl(auVar52);
  auVar197._0_8_ = auVar53._0_8_;
  auVar197._8_8_ = auVar197._0_8_;
  auVar207._0_8_ = auVar54._0_8_;
  auVar207._8_8_ = auVar207._0_8_;
  local_440 = vbroadcastss_avx512vl(ZEXT416((uint)fVar114));
  auVar36 = vxorps_avx512vl(local_440._0_16_,auVar47);
  local_3c0 = auVar36._0_4_;
  uStack_3bc = local_3c0;
  uStack_3b8 = local_3c0;
  uStack_3b4 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3ac = local_3c0;
  uStack_3a8 = local_3c0;
  uStack_3a4 = local_3c0;
  bVar29 = false;
  uVar23 = 0;
  fVar105 = *(float *)(ray + k * 4 + 0xc0);
  local_450 = vsubps_avx512vl(auVar45,auVar49);
  local_460 = vsubps_avx(auVar44,auVar45);
  local_470 = vsubps_avx(auVar51,auVar44);
  local_590 = vsubps_avx512vl(_local_540,local_500);
  local_5a0 = vsubps_avx512vl(_local_550,local_510);
  local_5b0 = vsubps_avx512vl(_local_560,local_520);
  _local_5c0 = vsubps_avx(_local_570,local_530);
  auVar113 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar113);
  auVar36 = ZEXT816(0x3f80000000000000);
  auVar88._32_32_ = auVar113._32_32_;
  auVar120 = auVar36;
LAB_01b97634:
  do {
    auVar50 = vshufps_avx(auVar120,auVar120,0x50);
    auVar255._8_4_ = 0x3f800000;
    auVar255._0_8_ = 0x3f8000003f800000;
    auVar255._12_4_ = 0x3f800000;
    auVar84._16_4_ = 0x3f800000;
    auVar84._0_16_ = auVar255;
    auVar84._20_4_ = 0x3f800000;
    auVar84._24_4_ = 0x3f800000;
    auVar84._28_4_ = 0x3f800000;
    auVar52 = vsubps_avx(auVar255,auVar50);
    fVar236 = auVar50._0_4_;
    fVar144 = auVar55._0_4_;
    auVar146._0_4_ = fVar144 * fVar236;
    fVar220 = auVar50._4_4_;
    fVar129 = auVar55._4_4_;
    auVar146._4_4_ = fVar129 * fVar220;
    fVar231 = auVar50._8_4_;
    auVar146._8_4_ = fVar144 * fVar231;
    fVar232 = auVar50._12_4_;
    auVar146._12_4_ = fVar129 * fVar232;
    fVar141 = auVar56._0_4_;
    auVar162._0_4_ = fVar141 * fVar236;
    fVar142 = auVar56._4_4_;
    auVar162._4_4_ = fVar142 * fVar220;
    auVar162._8_4_ = fVar141 * fVar231;
    auVar162._12_4_ = fVar142 * fVar232;
    fVar143 = auVar57._0_4_;
    auVar176._0_4_ = fVar143 * fVar236;
    fVar230 = auVar57._4_4_;
    auVar176._4_4_ = fVar230 * fVar220;
    auVar176._8_4_ = fVar143 * fVar231;
    auVar176._12_4_ = fVar230 * fVar232;
    fVar237 = auVar16._0_4_;
    auVar123._0_4_ = fVar237 * fVar236;
    fVar247 = auVar16._4_4_;
    auVar123._4_4_ = fVar247 * fVar220;
    auVar123._8_4_ = fVar237 * fVar231;
    auVar123._12_4_ = fVar247 * fVar232;
    auVar54 = vfmadd231ps_avx512vl(auVar146,auVar52,auVar37);
    auVar38 = vfmadd231ps_avx512vl(auVar162,auVar52,auVar48);
    auVar53 = vfmadd231ps_fma(auVar176,auVar52,auVar197);
    auVar52 = vfmadd231ps_fma(auVar123,auVar207,auVar52);
    auVar50 = vmovshdup_avx(auVar36);
    fVar220 = auVar36._0_4_;
    fVar236 = (auVar50._0_4_ - fVar220) * 0.04761905;
    auVar78._4_4_ = fVar220;
    auVar78._0_4_ = fVar220;
    auVar78._8_4_ = fVar220;
    auVar78._12_4_ = fVar220;
    auVar78._16_4_ = fVar220;
    auVar78._20_4_ = fVar220;
    auVar78._24_4_ = fVar220;
    auVar78._28_4_ = fVar220;
    auVar69._0_8_ = auVar50._0_8_;
    auVar69._8_8_ = auVar69._0_8_;
    auVar69._16_8_ = auVar69._0_8_;
    auVar69._24_8_ = auVar69._0_8_;
    auVar81 = vsubps_avx(auVar69,auVar78);
    uVar106 = auVar54._0_4_;
    auVar82._4_4_ = uVar106;
    auVar82._0_4_ = uVar106;
    auVar82._8_4_ = uVar106;
    auVar82._12_4_ = uVar106;
    auVar82._16_4_ = uVar106;
    auVar82._20_4_ = uVar106;
    auVar82._24_4_ = uVar106;
    auVar82._28_4_ = uVar106;
    auVar71._8_4_ = 1;
    auVar71._0_8_ = 0x100000001;
    auVar71._12_4_ = 1;
    auVar71._16_4_ = 1;
    auVar71._20_4_ = 1;
    auVar71._24_4_ = 1;
    auVar71._28_4_ = 1;
    auVar80 = ZEXT1632(auVar54);
    auVar79 = vpermps_avx2(auVar71,auVar80);
    auVar65 = vbroadcastss_avx512vl(auVar38);
    auVar74 = ZEXT1632(auVar38);
    auVar66 = vpermps_avx512vl(auVar71,auVar74);
    auVar67 = vbroadcastss_avx512vl(auVar53);
    auVar75 = ZEXT1632(auVar53);
    auVar68 = vpermps_avx512vl(auVar71,auVar75);
    auVar69 = vbroadcastss_avx512vl(auVar52);
    auVar77 = ZEXT1632(auVar52);
    auVar70 = vpermps_avx512vl(auVar71,auVar77);
    auVar83._4_4_ = fVar236;
    auVar83._0_4_ = fVar236;
    auVar83._8_4_ = fVar236;
    auVar83._12_4_ = fVar236;
    auVar83._16_4_ = fVar236;
    auVar83._20_4_ = fVar236;
    auVar83._24_4_ = fVar236;
    auVar83._28_4_ = fVar236;
    auVar76._8_4_ = 2;
    auVar76._0_8_ = 0x200000002;
    auVar76._12_4_ = 2;
    auVar76._16_4_ = 2;
    auVar76._20_4_ = 2;
    auVar76._24_4_ = 2;
    auVar76._28_4_ = 2;
    auVar71 = vpermps_avx512vl(auVar76,auVar80);
    auVar85._0_32_ = vbroadcastss_avx512vl(ZEXT416(3));
    auVar72 = vpermps_avx512vl(auVar85._0_32_,auVar80);
    auVar73 = vpermps_avx512vl(auVar76,auVar74);
    auVar74 = vpermps_avx512vl(auVar85._0_32_,auVar74);
    auVar80 = vpermps_avx2(auVar76,auVar75);
    auVar75 = vpermps_avx512vl(auVar85._0_32_,auVar75);
    auVar76 = vpermps_avx512vl(auVar76,auVar77);
    auVar85._0_32_ = vpermps_avx512vl(auVar85._0_32_,auVar77);
    auVar50 = vfmadd132ps_fma(auVar81,auVar78,_DAT_01faff20);
    auVar81 = vsubps_avx(auVar84,ZEXT1632(auVar50));
    auVar77 = vmulps_avx512vl(auVar65,ZEXT1632(auVar50));
    auVar84 = ZEXT1632(auVar50);
    auVar78 = vmulps_avx512vl(auVar66,auVar84);
    auVar52 = vfmadd231ps_fma(auVar77,auVar81,auVar82);
    auVar53 = vfmadd231ps_fma(auVar78,auVar81,auVar79);
    auVar77 = vmulps_avx512vl(auVar67,auVar84);
    auVar78 = vmulps_avx512vl(auVar68,auVar84);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar65);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar81,auVar66);
    auVar65 = vmulps_avx512vl(auVar69,auVar84);
    auVar82 = ZEXT1632(auVar50);
    auVar66 = vmulps_avx512vl(auVar70,auVar82);
    auVar67 = vfmadd231ps_avx512vl(auVar65,auVar81,auVar67);
    auVar68 = vfmadd231ps_avx512vl(auVar66,auVar81,auVar68);
    fVar231 = auVar50._0_4_;
    fVar232 = auVar50._4_4_;
    auVar65._4_4_ = fVar232 * auVar77._4_4_;
    auVar65._0_4_ = fVar231 * auVar77._0_4_;
    fVar233 = auVar50._8_4_;
    auVar65._8_4_ = fVar233 * auVar77._8_4_;
    fVar234 = auVar50._12_4_;
    auVar65._12_4_ = fVar234 * auVar77._12_4_;
    auVar65._16_4_ = auVar77._16_4_ * 0.0;
    auVar65._20_4_ = auVar77._20_4_ * 0.0;
    auVar65._24_4_ = auVar77._24_4_ * 0.0;
    auVar65._28_4_ = fVar220;
    auVar66._4_4_ = fVar232 * auVar78._4_4_;
    auVar66._0_4_ = fVar231 * auVar78._0_4_;
    auVar66._8_4_ = fVar233 * auVar78._8_4_;
    auVar66._12_4_ = fVar234 * auVar78._12_4_;
    auVar66._16_4_ = auVar78._16_4_ * 0.0;
    auVar66._20_4_ = auVar78._20_4_ * 0.0;
    auVar66._24_4_ = auVar78._24_4_ * 0.0;
    auVar66._28_4_ = auVar79._28_4_;
    auVar52 = vfmadd231ps_fma(auVar65,auVar81,ZEXT1632(auVar52));
    auVar53 = vfmadd231ps_fma(auVar66,auVar81,ZEXT1632(auVar53));
    auVar70._0_4_ = fVar231 * auVar67._0_4_;
    auVar70._4_4_ = fVar232 * auVar67._4_4_;
    auVar70._8_4_ = fVar233 * auVar67._8_4_;
    auVar70._12_4_ = fVar234 * auVar67._12_4_;
    auVar70._16_4_ = auVar67._16_4_ * 0.0;
    auVar70._20_4_ = auVar67._20_4_ * 0.0;
    auVar70._24_4_ = auVar67._24_4_ * 0.0;
    auVar70._28_4_ = 0;
    auVar79._4_4_ = fVar232 * auVar68._4_4_;
    auVar79._0_4_ = fVar231 * auVar68._0_4_;
    auVar79._8_4_ = fVar233 * auVar68._8_4_;
    auVar79._12_4_ = fVar234 * auVar68._12_4_;
    auVar79._16_4_ = auVar68._16_4_ * 0.0;
    auVar79._20_4_ = auVar68._20_4_ * 0.0;
    auVar79._24_4_ = auVar68._24_4_ * 0.0;
    auVar79._28_4_ = auVar67._28_4_;
    auVar54 = vfmadd231ps_fma(auVar70,auVar81,auVar77);
    auVar38 = vfmadd231ps_fma(auVar79,auVar81,auVar78);
    auVar67._28_4_ = auVar78._28_4_;
    auVar67._0_28_ =
         ZEXT1628(CONCAT412(fVar234 * auVar38._12_4_,
                            CONCAT48(fVar233 * auVar38._8_4_,
                                     CONCAT44(fVar232 * auVar38._4_4_,fVar231 * auVar38._0_4_))));
    auVar39 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar234 * auVar54._12_4_,
                                                 CONCAT48(fVar233 * auVar54._8_4_,
                                                          CONCAT44(fVar232 * auVar54._4_4_,
                                                                   fVar231 * auVar54._0_4_)))),
                              auVar81,ZEXT1632(auVar52));
    auVar40 = vfmadd231ps_fma(auVar67,auVar81,ZEXT1632(auVar53));
    auVar79 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar52));
    auVar65 = vsubps_avx(ZEXT1632(auVar38),ZEXT1632(auVar53));
    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar79 = vmulps_avx512vl(auVar79,auVar66);
    auVar65 = vmulps_avx512vl(auVar65,auVar66);
    auVar77._0_4_ = fVar236 * auVar79._0_4_;
    auVar77._4_4_ = fVar236 * auVar79._4_4_;
    auVar77._8_4_ = fVar236 * auVar79._8_4_;
    auVar77._12_4_ = fVar236 * auVar79._12_4_;
    auVar77._16_4_ = fVar236 * auVar79._16_4_;
    auVar77._20_4_ = fVar236 * auVar79._20_4_;
    auVar77._24_4_ = fVar236 * auVar79._24_4_;
    auVar77._28_4_ = 0;
    auVar79 = vmulps_avx512vl(auVar83,auVar65);
    auVar53 = vxorps_avx512vl(auVar69._0_16_,auVar69._0_16_);
    auVar65 = vpermt2ps_avx512vl(ZEXT1632(auVar39),_DAT_01feed00,ZEXT1632(auVar53));
    auVar67 = vpermt2ps_avx512vl(ZEXT1632(auVar40),_DAT_01feed00,ZEXT1632(auVar53));
    auVar128._0_4_ = auVar77._0_4_ + auVar39._0_4_;
    auVar128._4_4_ = auVar77._4_4_ + auVar39._4_4_;
    auVar128._8_4_ = auVar77._8_4_ + auVar39._8_4_;
    auVar128._12_4_ = auVar77._12_4_ + auVar39._12_4_;
    auVar128._16_4_ = auVar77._16_4_ + 0.0;
    auVar128._20_4_ = auVar77._20_4_ + 0.0;
    auVar128._24_4_ = auVar77._24_4_ + 0.0;
    auVar128._28_4_ = 0;
    auVar78 = ZEXT1632(auVar53);
    auVar68 = vpermt2ps_avx512vl(auVar77,_DAT_01feed00,auVar78);
    auVar69 = vaddps_avx512vl(ZEXT1632(auVar40),auVar79);
    auVar70 = vpermt2ps_avx512vl(auVar79,_DAT_01feed00,auVar78);
    auVar79 = vsubps_avx(auVar65,auVar68);
    auVar70 = vsubps_avx512vl(auVar67,auVar70);
    auVar68 = vmulps_avx512vl(auVar73,auVar82);
    auVar77 = vmulps_avx512vl(auVar74,auVar82);
    auVar68 = vfmadd231ps_avx512vl(auVar68,auVar81,auVar71);
    auVar71 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar72);
    auVar72 = vmulps_avx512vl(auVar80,auVar82);
    auVar77 = vmulps_avx512vl(auVar75,auVar82);
    auVar72 = vfmadd231ps_avx512vl(auVar72,auVar81,auVar73);
    auVar73 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar74);
    auVar74 = vmulps_avx512vl(auVar76,auVar82);
    auVar85._0_32_ = vmulps_avx512vl(auVar85._0_32_,auVar82);
    auVar52 = vfmadd231ps_fma(auVar74,auVar81,auVar80);
    auVar80 = vfmadd231ps_avx512vl(auVar85._0_32_,auVar81,auVar75);
    auVar85._0_32_ = vmulps_avx512vl(auVar82,auVar72);
    auVar76 = ZEXT1632(auVar50);
    auVar74 = vmulps_avx512vl(auVar76,auVar73);
    auVar68 = vfmadd231ps_avx512vl(auVar85._0_32_,auVar81,auVar68);
    auVar71 = vfmadd231ps_avx512vl(auVar74,auVar81,auVar71);
    auVar80 = vmulps_avx512vl(auVar76,auVar80);
    auVar85._0_32_ =
         vfmadd231ps_avx512vl
                   (ZEXT1632(CONCAT412(fVar234 * auVar52._12_4_,
                                       CONCAT48(fVar233 * auVar52._8_4_,
                                                CONCAT44(fVar232 * auVar52._4_4_,
                                                         fVar231 * auVar52._0_4_)))),auVar81,auVar72
                   );
    auVar72 = vfmadd231ps_avx512vl(auVar80,auVar81,auVar73);
    auVar80._4_4_ = fVar232 * auVar85._4_4_;
    auVar80._0_4_ = fVar231 * auVar85._0_4_;
    auVar80._8_4_ = fVar233 * auVar85._8_4_;
    auVar80._12_4_ = fVar234 * auVar85._12_4_;
    auVar80._16_4_ = auVar85._16_4_ * 0.0;
    auVar80._20_4_ = auVar85._20_4_ * 0.0;
    auVar80._24_4_ = auVar85._24_4_ * 0.0;
    auVar80._28_4_ = auVar75._28_4_;
    auVar73 = vmulps_avx512vl(auVar76,auVar72);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar81,auVar68);
    auVar73 = vfmadd231ps_avx512vl(auVar73,auVar71,auVar81);
    auVar81 = vsubps_avx512vl(auVar85._0_32_,auVar68);
    auVar68 = vsubps_avx512vl(auVar72,auVar71);
    auVar71 = vmulps_avx512vl(auVar81,auVar66);
    auVar66 = vmulps_avx512vl(auVar68,auVar66);
    fVar220 = fVar236 * auVar71._0_4_;
    fVar231 = fVar236 * auVar71._4_4_;
    auVar81._4_4_ = fVar231;
    auVar81._0_4_ = fVar220;
    fVar232 = fVar236 * auVar71._8_4_;
    auVar81._8_4_ = fVar232;
    fVar233 = fVar236 * auVar71._12_4_;
    auVar81._12_4_ = fVar233;
    fVar234 = fVar236 * auVar71._16_4_;
    auVar81._16_4_ = fVar234;
    fVar235 = fVar236 * auVar71._20_4_;
    auVar81._20_4_ = fVar235;
    fVar236 = fVar236 * auVar71._24_4_;
    auVar81._24_4_ = fVar236;
    auVar81._28_4_ = auVar71._28_4_;
    auVar66 = vmulps_avx512vl(auVar83,auVar66);
    auVar85._0_32_ = vpermt2ps_avx512vl(auVar80,_DAT_01feed00,auVar78);
    auVar72 = vpermt2ps_avx512vl(auVar73,_DAT_01feed00,auVar78);
    auVar219._0_4_ = auVar80._0_4_ + fVar220;
    auVar219._4_4_ = auVar80._4_4_ + fVar231;
    auVar219._8_4_ = auVar80._8_4_ + fVar232;
    auVar219._12_4_ = auVar80._12_4_ + fVar233;
    auVar219._16_4_ = auVar80._16_4_ + fVar234;
    auVar219._20_4_ = auVar80._20_4_ + fVar235;
    auVar219._24_4_ = auVar80._24_4_ + fVar236;
    auVar219._28_4_ = auVar80._28_4_ + auVar71._28_4_;
    auVar81 = vpermt2ps_avx512vl(auVar81,_DAT_01feed00,ZEXT1632(auVar53));
    auVar71 = vaddps_avx512vl(auVar73,auVar66);
    auVar66 = vpermt2ps_avx512vl(auVar66,_DAT_01feed00,ZEXT1632(auVar53));
    auVar81 = vsubps_avx(auVar85._0_32_,auVar81);
    auVar66 = vsubps_avx512vl(auVar72,auVar66);
    in_ZMM17 = ZEXT3264(auVar66);
    auVar150 = ZEXT1632(auVar39);
    auVar68 = vsubps_avx512vl(auVar80,auVar150);
    auVar168 = ZEXT1632(auVar40);
    auVar74 = vsubps_avx512vl(auVar73,auVar168);
    auVar75 = vsubps_avx512vl(auVar85._0_32_,auVar65);
    auVar68 = vaddps_avx512vl(auVar68,auVar75);
    auVar75 = vsubps_avx512vl(auVar72,auVar67);
    auVar74 = vaddps_avx512vl(auVar74,auVar75);
    auVar75 = vmulps_avx512vl(auVar168,auVar68);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar150,auVar74);
    auVar76 = vmulps_avx512vl(auVar69,auVar68);
    auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar128,auVar74);
    auVar77 = vmulps_avx512vl(auVar70,auVar68);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar79,auVar74);
    auVar78 = vmulps_avx512vl(auVar67,auVar68);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar65,auVar74);
    auVar82 = vmulps_avx512vl(auVar73,auVar68);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar80,auVar74);
    auVar83 = vmulps_avx512vl(auVar71,auVar68);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar219,auVar74);
    auVar84 = vmulps_avx512vl(auVar66,auVar68);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar81,auVar74);
    auVar68 = vmulps_avx512vl(auVar72,auVar68);
    auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar85._0_32_,auVar74);
    auVar74 = vminps_avx512vl(auVar75,auVar76);
    auVar75 = vmaxps_avx512vl(auVar75,auVar76);
    auVar76 = vminps_avx512vl(auVar77,auVar78);
    auVar74 = vminps_avx512vl(auVar74,auVar76);
    auVar76 = vmaxps_avx512vl(auVar77,auVar78);
    auVar75 = vmaxps_avx512vl(auVar75,auVar76);
    auVar76 = vminps_avx512vl(auVar82,auVar83);
    auVar77 = vmaxps_avx512vl(auVar82,auVar83);
    auVar78 = vminps_avx512vl(auVar84,auVar68);
    auVar76 = vminps_avx512vl(auVar76,auVar78);
    auVar74 = vminps_avx512vl(auVar74,auVar76);
    auVar68 = vmaxps_avx512vl(auVar84,auVar68);
    auVar68 = vmaxps_avx512vl(auVar77,auVar68);
    auVar75 = vmaxps_avx512vl(auVar75,auVar68);
    uVar14 = vcmpps_avx512vl(auVar74,local_440,2);
    auVar68._4_4_ = uStack_3bc;
    auVar68._0_4_ = local_3c0;
    auVar68._8_4_ = uStack_3b8;
    auVar68._12_4_ = uStack_3b4;
    auVar68._16_4_ = uStack_3b0;
    auVar68._20_4_ = uStack_3ac;
    auVar68._24_4_ = uStack_3a8;
    auVar68._28_4_ = uStack_3a4;
    uVar15 = vcmpps_avx512vl(auVar75,auVar68,5);
    bVar21 = (byte)uVar14 & (byte)uVar15 & 0x7f;
    if (bVar21 == 0) {
      auVar36 = vxorps_avx512vl(auVar75._0_16_,auVar75._0_16_);
      auVar50 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar85._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar86._32_32_ = auVar88._32_32_;
      auVar86._0_32_ = _DAT_01feed20;
      auVar103 = auVar86._16_48_;
    }
    else {
      auVar74 = vsubps_avx512vl(auVar65,auVar150);
      auVar75 = vsubps_avx512vl(auVar67,auVar168);
      auVar76 = vsubps_avx512vl(auVar85._0_32_,auVar80);
      auVar74 = vaddps_avx512vl(auVar74,auVar76);
      auVar76 = vsubps_avx512vl(auVar72,auVar73);
      auVar75 = vaddps_avx512vl(auVar75,auVar76);
      auVar76 = vmulps_avx512vl(auVar168,auVar74);
      auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar75,auVar150);
      auVar69 = vmulps_avx512vl(auVar69,auVar74);
      auVar69 = vfnmadd213ps_avx512vl(auVar128,auVar75,auVar69);
      auVar70 = vmulps_avx512vl(auVar70,auVar74);
      auVar70 = vfnmadd213ps_avx512vl(auVar79,auVar75,auVar70);
      auVar79 = vmulps_avx512vl(auVar67,auVar74);
      auVar67 = vfnmadd231ps_avx512vl(auVar79,auVar75,auVar65);
      auVar79 = vmulps_avx512vl(auVar73,auVar74);
      auVar73 = vfnmadd231ps_avx512vl(auVar79,auVar75,auVar80);
      auVar79 = vmulps_avx512vl(auVar71,auVar74);
      auVar71 = vfnmadd213ps_avx512vl(auVar219,auVar75,auVar79);
      auVar79 = vmulps_avx512vl(auVar66,auVar74);
      auVar77 = vfnmadd213ps_avx512vl(auVar81,auVar75,auVar79);
      auVar81 = vmulps_avx512vl(auVar72,auVar74);
      auVar85._0_32_ = vfnmadd231ps_avx512vl(auVar81,auVar85._0_32_,auVar75);
      auVar79 = vminps_avx(auVar76,auVar69);
      auVar81 = vmaxps_avx(auVar76,auVar69);
      auVar65 = vminps_avx(auVar70,auVar67);
      auVar65 = vminps_avx(auVar79,auVar65);
      auVar79 = vmaxps_avx(auVar70,auVar67);
      auVar81 = vmaxps_avx(auVar81,auVar79);
      auVar80 = vminps_avx(auVar73,auVar71);
      auVar79 = vmaxps_avx(auVar73,auVar71);
      auVar66 = vminps_avx(auVar77,auVar85._0_32_);
      auVar80 = vminps_avx(auVar80,auVar66);
      auVar80 = vminps_avx(auVar65,auVar80);
      auVar65 = vmaxps_avx(auVar77,auVar85._0_32_);
      auVar79 = vmaxps_avx(auVar79,auVar65);
      auVar81 = vmaxps_avx(auVar81,auVar79);
      uVar14 = vcmpps_avx512vl(auVar81,auVar68,5);
      uVar15 = vcmpps_avx512vl(auVar80,local_440,2);
      bVar21 = bVar21 & (byte)uVar14 & (byte)uVar15;
      if (bVar21 != 0) {
        auStack_600[uVar23] = (uint)bVar21;
        uVar14 = vmovlps_avx(auVar36);
        (&uStack_420)[uVar23] = uVar14;
        uVar3 = vmovlps_avx(auVar120);
        auStack_3a0[uVar23] = uVar3;
        uVar23 = (ulong)((int)uVar23 + 1);
      }
      auVar36 = vxorps_avx512vl(auVar74._0_16_,auVar74._0_16_);
      auVar50 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar85._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar85._32_32_ = auVar88._32_32_;
      auVar103 = auVar85._16_48_;
      auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    }
    auVar270 = ZEXT1664(auVar50);
    auVar269 = ZEXT3264(_DAT_01feed20);
    in_ZMM21 = ZEXT464(0x3e2aaaab);
    auVar268 = ZEXT1664(auVar52);
    auVar267 = ZEXT3264(auVar85._0_32_);
    auVar113 = ZEXT1664(auVar36);
    auVar87._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar87._16_48_ = auVar103;
    auVar273 = ZEXT1664(auVar87._0_16_);
LAB_01b97b9c:
    do {
      do {
        auVar50 = auVar113._0_16_;
        auVar52 = auVar270._0_16_;
        if ((int)uVar23 == 0) {
          if (bVar29 != false) {
            return bVar29;
          }
          uVar106 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar20._4_4_ = uVar106;
          auVar20._0_4_ = uVar106;
          auVar20._8_4_ = uVar106;
          auVar20._12_4_ = uVar106;
          uVar14 = vcmpps_avx512vl(local_580,auVar20,2);
          uVar30 = (uint)uVar35 & (uint)uVar35 + 0xf & (uint)uVar14;
          uVar35 = (ulong)uVar30;
          if (uVar30 == 0) {
            return false;
          }
          goto LAB_01b96b2d;
        }
        uVar22 = (int)uVar23 - 1;
        uVar24 = (ulong)uVar22;
        uVar7 = auStack_600[uVar24];
        auVar120._8_8_ = 0;
        auVar120._0_8_ = auStack_3a0[uVar24];
        uVar3 = 0;
        for (uVar28 = (ulong)uVar7; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
          uVar3 = uVar3 + 1;
        }
        uVar26 = uVar7 - 1 & uVar7;
        bVar33 = uVar26 == 0;
        auStack_600[uVar24] = uVar26;
        if (bVar33) {
          uVar23 = (ulong)uVar22;
        }
        auVar109._8_8_ = 0;
        auVar109._0_8_ = uVar3;
        auVar36 = vpunpcklqdq_avx(auVar109,ZEXT416((int)uVar3 + 1));
        auVar88._32_32_ = auVar87._32_32_;
        auVar36 = vcvtqq2ps_avx512vl(auVar36);
        auVar36 = vmulps_avx512vl(auVar36,auVar268._0_16_);
        uVar106 = *(undefined4 *)((long)&uStack_420 + uVar24 * 8 + 4);
        auVar17._4_4_ = uVar106;
        auVar17._0_4_ = uVar106;
        auVar17._8_4_ = uVar106;
        auVar17._12_4_ = uVar106;
        auVar53 = vmulps_avx512vl(auVar36,auVar17);
        auVar136._8_4_ = 0x3f800000;
        auVar136._0_8_ = 0x3f8000003f800000;
        auVar136._12_4_ = 0x3f800000;
        auVar36 = vsubps_avx(auVar136,auVar36);
        uVar106 = *(undefined4 *)(&uStack_420 + uVar24);
        auVar18._4_4_ = uVar106;
        auVar18._0_4_ = uVar106;
        auVar18._8_4_ = uVar106;
        auVar18._12_4_ = uVar106;
        auVar36 = vfmadd231ps_avx512vl(auVar53,auVar36,auVar18);
        auVar53 = vmovshdup_avx(auVar36);
        fVar236 = auVar53._0_4_ - auVar36._0_4_;
        auVar53 = vucomiss_avx512f(ZEXT416((uint)fVar236));
        in_ZMM21 = ZEXT1664(auVar53);
        if (uVar7 == 0 || bVar33) goto LAB_01b97634;
        auVar53 = vshufps_avx(auVar120,auVar120,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar236));
        auVar147._8_4_ = 0x3f800000;
        auVar147._0_8_ = 0x3f8000003f800000;
        auVar147._12_4_ = 0x3f800000;
        auVar54 = vsubps_avx(auVar147,auVar53);
        fVar220 = auVar53._0_4_;
        auVar163._0_4_ = fVar220 * fVar144;
        fVar231 = auVar53._4_4_;
        auVar163._4_4_ = fVar231 * fVar129;
        fVar232 = auVar53._8_4_;
        auVar163._8_4_ = fVar232 * fVar144;
        fVar233 = auVar53._12_4_;
        auVar163._12_4_ = fVar233 * fVar129;
        auVar177._0_4_ = fVar220 * fVar141;
        auVar177._4_4_ = fVar231 * fVar142;
        auVar177._8_4_ = fVar232 * fVar141;
        auVar177._12_4_ = fVar233 * fVar142;
        auVar185._0_4_ = fVar220 * fVar143;
        auVar185._4_4_ = fVar231 * fVar230;
        auVar185._8_4_ = fVar232 * fVar143;
        auVar185._12_4_ = fVar233 * fVar230;
        auVar137._0_4_ = fVar220 * fVar237;
        auVar137._4_4_ = fVar231 * fVar247;
        auVar137._8_4_ = fVar232 * fVar237;
        auVar137._12_4_ = fVar233 * fVar247;
        auVar53 = vfmadd231ps_fma(auVar163,auVar54,auVar37);
        auVar38 = vfmadd231ps_fma(auVar177,auVar54,auVar48);
        auVar39 = vfmadd231ps_fma(auVar185,auVar54,auVar197);
        auVar54 = vfmadd231ps_fma(auVar137,auVar54,auVar207);
        auVar72._16_16_ = auVar53;
        auVar72._0_16_ = auVar53;
        auVar73._16_16_ = auVar38;
        auVar73._0_16_ = auVar38;
        auVar75._16_16_ = auVar39;
        auVar75._0_16_ = auVar39;
        auVar79 = vpermps_avx512vl(auVar269._0_32_,ZEXT1632(auVar36));
        auVar81 = vsubps_avx(auVar73,auVar72);
        auVar38 = vfmadd213ps_fma(auVar81,auVar79,auVar72);
        auVar81 = vsubps_avx(auVar75,auVar73);
        auVar40 = vfmadd213ps_fma(auVar81,auVar79,auVar73);
        auVar53 = vsubps_avx(auVar54,auVar39);
        auVar74._16_16_ = auVar53;
        auVar74._0_16_ = auVar53;
        auVar53 = vfmadd213ps_fma(auVar74,auVar79,auVar75);
        auVar81 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar38));
        auVar54 = vfmadd213ps_fma(auVar81,auVar79,ZEXT1632(auVar38));
        auVar81 = vsubps_avx(ZEXT1632(auVar53),ZEXT1632(auVar40));
        auVar53 = vfmadd213ps_fma(auVar81,auVar79,ZEXT1632(auVar40));
        auVar81 = vsubps_avx(ZEXT1632(auVar53),ZEXT1632(auVar54));
        auVar64 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar81,auVar79);
        auVar88._0_32_ = vmulps_avx512vl(auVar81,auVar267._0_32_);
        auVar87._16_48_ = auVar88._16_48_;
        auVar53 = vmulss_avx512f(ZEXT416((uint)fVar236),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar220 = auVar53._0_4_;
        auVar186._0_8_ =
             CONCAT44(auVar64._4_4_ + fVar220 * auVar88._4_4_,
                      auVar64._0_4_ + fVar220 * auVar88._0_4_);
        auVar186._8_4_ = auVar64._8_4_ + fVar220 * auVar88._8_4_;
        auVar186._12_4_ = auVar64._12_4_ + fVar220 * auVar88._12_4_;
        auVar164._0_4_ = fVar220 * auVar88._16_4_;
        auVar164._4_4_ = fVar220 * auVar88._20_4_;
        auVar164._8_4_ = fVar220 * auVar88._24_4_;
        auVar164._12_4_ = fVar220 * auVar88._28_4_;
        auVar46 = vsubps_avx((undefined1  [16])0x0,auVar164);
        auVar40 = vshufpd_avx(auVar64,auVar64,3);
        auVar41 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar53 = vsubps_avx(auVar40,auVar64);
        auVar54 = vsubps_avx(auVar41,(undefined1  [16])0x0);
        auVar208._0_4_ = auVar53._0_4_ + auVar54._0_4_;
        auVar208._4_4_ = auVar53._4_4_ + auVar54._4_4_;
        auVar208._8_4_ = auVar53._8_4_ + auVar54._8_4_;
        auVar208._12_4_ = auVar53._12_4_ + auVar54._12_4_;
        auVar53 = vshufps_avx(auVar64,auVar64,0xb1);
        auVar54 = vshufps_avx(auVar186,auVar186,0xb1);
        auVar38 = vshufps_avx(auVar46,auVar46,0xb1);
        auVar39 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar256._4_4_ = auVar208._0_4_;
        auVar256._0_4_ = auVar208._0_4_;
        auVar256._8_4_ = auVar208._0_4_;
        auVar256._12_4_ = auVar208._0_4_;
        auVar42 = vshufps_avx(auVar208,auVar208,0x55);
        fVar220 = auVar42._0_4_;
        auVar217._0_4_ = auVar53._0_4_ * fVar220;
        fVar231 = auVar42._4_4_;
        auVar217._4_4_ = auVar53._4_4_ * fVar231;
        fVar232 = auVar42._8_4_;
        auVar217._8_4_ = auVar53._8_4_ * fVar232;
        fVar233 = auVar42._12_4_;
        auVar217._12_4_ = auVar53._12_4_ * fVar233;
        auVar222._0_4_ = auVar54._0_4_ * fVar220;
        auVar222._4_4_ = auVar54._4_4_ * fVar231;
        auVar222._8_4_ = auVar54._8_4_ * fVar232;
        auVar222._12_4_ = auVar54._12_4_ * fVar233;
        auVar241._0_4_ = auVar38._0_4_ * fVar220;
        auVar241._4_4_ = auVar38._4_4_ * fVar231;
        auVar241._8_4_ = auVar38._8_4_ * fVar232;
        auVar241._12_4_ = auVar38._12_4_ * fVar233;
        auVar209._0_4_ = auVar39._0_4_ * fVar220;
        auVar209._4_4_ = auVar39._4_4_ * fVar231;
        auVar209._8_4_ = auVar39._8_4_ * fVar232;
        auVar209._12_4_ = auVar39._12_4_ * fVar233;
        auVar53 = vfmadd231ps_fma(auVar217,auVar256,auVar64);
        auVar54 = vfmadd231ps_fma(auVar222,auVar256,auVar186);
        auVar47 = vfmadd231ps_fma(auVar241,auVar256,auVar46);
        auVar60 = vfmadd231ps_fma(auVar209,(undefined1  [16])0x0,auVar256);
        auVar42 = vshufpd_avx(auVar53,auVar53,1);
        auVar43 = vshufpd_avx(auVar54,auVar54,1);
        auVar58 = vshufpd_avx512vl(auVar47,auVar47,1);
        auVar59 = vshufpd_avx512vl(auVar60,auVar60,1);
        in_ZMM17 = ZEXT1664(auVar59);
        auVar38 = vminss_avx(auVar53,auVar54);
        auVar53 = vmaxss_avx(auVar54,auVar53);
        auVar39 = vminss_avx(auVar47,auVar60);
        auVar54 = vmaxss_avx(auVar60,auVar47);
        auVar38 = vminss_avx(auVar38,auVar39);
        auVar53 = vmaxss_avx(auVar54,auVar53);
        auVar39 = vminss_avx(auVar42,auVar43);
        auVar54 = vmaxss_avx(auVar43,auVar42);
        auVar42 = vminss_avx512f(auVar58,auVar59);
        auVar43 = vmaxss_avx512f(auVar59,auVar58);
        auVar54 = vmaxss_avx(auVar43,auVar54);
        auVar87._0_16_ = vminss_avx512f(auVar39,auVar42);
        vucomiss_avx512f(auVar38);
        fVar231 = auVar54._0_4_;
        fVar220 = auVar53._0_4_;
        if (4 < (uint)uVar23) {
          bVar34 = fVar231 == -0.0001;
          bVar31 = NAN(fVar231);
          if (fVar231 <= -0.0001) goto LAB_01b97dd9;
          break;
        }
LAB_01b97dd9:
        auVar39 = vucomiss_avx512f(auVar87._0_16_);
        bVar34 = fVar231 <= -0.0001;
        bVar32 = -0.0001 < fVar220;
        bVar31 = bVar34;
        if (!bVar34) break;
        uVar14 = vcmpps_avx512vl(auVar38,auVar39,5);
        uVar15 = vcmpps_avx512vl(auVar87._0_16_,auVar39,5);
        bVar21 = (byte)uVar14 & (byte)uVar15 & 1;
        bVar34 = bVar32 && bVar21 == 0;
        bVar31 = bVar32 && bVar21 == 0;
      } while (!bVar32 || bVar21 != 0);
      vcmpss_avx512f(auVar38,auVar50,1);
      auVar47 = auVar272._0_16_;
      uVar14 = vcmpss_avx512f(auVar53,auVar50,1);
      bVar32 = (bool)((byte)uVar14 & 1);
      auVar90._16_48_ = auVar87._16_48_;
      auVar90._0_16_ = auVar47;
      iVar104 = auVar272._0_4_;
      auVar89._4_60_ = auVar90._4_60_;
      auVar89._0_4_ = (float)((uint)bVar32 * -0x40800000 + (uint)!bVar32 * iVar104);
      vucomiss_avx512f(auVar89._0_16_);
      bVar31 = (bool)(!bVar34 | bVar31);
      bVar32 = bVar31 == false;
      auVar92._16_48_ = auVar87._16_48_;
      auVar92._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar91._4_60_ = auVar92._4_60_;
      auVar91._0_4_ = (uint)bVar31 * auVar113._0_4_ + (uint)!bVar31 * 0x7f800000;
      auVar42 = auVar91._0_16_;
      auVar94._16_48_ = auVar87._16_48_;
      auVar94._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar93._4_60_ = auVar94._4_60_;
      auVar93._0_4_ = (uint)bVar31 * auVar113._0_4_ + (uint)!bVar31 * -0x800000;
      auVar39 = auVar93._0_16_;
      uVar14 = vcmpss_avx512f(auVar87._0_16_,auVar50,1);
      bVar34 = (bool)((byte)uVar14 & 1);
      auVar96._16_48_ = auVar87._16_48_;
      auVar96._0_16_ = auVar47;
      auVar95._4_60_ = auVar96._4_60_;
      auVar95._0_4_ = (float)((uint)bVar34 * -0x40800000 + (uint)!bVar34 * iVar104);
      auVar43 = vucomiss_avx512f(auVar95._0_16_);
      in_ZMM17 = ZEXT1664(auVar43);
      if ((bVar31) || (bVar32)) {
        auVar43 = vucomiss_avx512f(auVar38);
        if ((bVar31) || (bVar32)) {
          auVar60 = vxorps_avx512vl(auVar38,auVar273._0_16_);
          in_ZMM17 = ZEXT1664(auVar60);
          auVar38 = vsubss_avx512f(auVar43,auVar38);
          auVar38 = vdivss_avx512f(auVar60,auVar38);
          auVar43 = vsubss_avx512f(auVar47,auVar38);
          auVar38 = vfmadd213ss_avx512f(auVar43,auVar50,auVar38);
          auVar43 = auVar38;
        }
        else {
          auVar43 = vxorps_avx512vl(auVar43,auVar43);
          vucomiss_avx512f(auVar43);
          if ((bVar31) || (auVar38 = auVar47, bVar32)) {
            auVar38 = SUB6416(ZEXT464(0xff800000),0);
            auVar43 = ZEXT416(0x7f800000);
          }
        }
        auVar42 = vminss_avx512f(auVar42,auVar43);
        auVar39 = vmaxss_avx(auVar38,auVar39);
      }
      uVar14 = vcmpss_avx512f(auVar54,auVar50,1);
      bVar34 = (bool)((byte)uVar14 & 1);
      fVar232 = (float)((uint)bVar34 * -0x40800000 + (uint)!bVar34 * iVar104);
      if ((auVar89._0_4_ != fVar232) || (NAN(auVar89._0_4_) || NAN(fVar232))) {
        if ((fVar231 != fVar220) || (NAN(fVar231) || NAN(fVar220))) {
          auVar53 = vxorps_avx512vl(auVar53,auVar273._0_16_);
          auVar210._0_4_ = auVar53._0_4_ / (fVar231 - fVar220);
          auVar210._4_12_ = auVar53._4_12_;
          auVar53 = vsubss_avx512f(auVar47,auVar210);
          auVar53 = vfmadd213ss_avx512f(auVar53,auVar50,auVar210);
          auVar54 = auVar53;
        }
        else if ((fVar220 != 0.0) ||
                (auVar53 = auVar47, auVar54 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar220))) {
          auVar53 = SUB6416(ZEXT464(0xff800000),0);
          auVar54 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar42 = vminss_avx(auVar42,auVar54);
        auVar39 = vmaxss_avx(auVar53,auVar39);
      }
      bVar34 = auVar95._0_4_ != fVar232;
      auVar53 = vminss_avx512f(auVar42,auVar47);
      auVar98._16_48_ = auVar87._16_48_;
      auVar98._0_16_ = auVar42;
      auVar97._4_60_ = auVar98._4_60_;
      auVar97._0_4_ = (uint)bVar34 * auVar53._0_4_ + (uint)!bVar34 * auVar42._0_4_;
      auVar53 = vmaxss_avx512f(auVar47,auVar39);
      auVar100._16_48_ = auVar87._16_48_;
      auVar100._0_16_ = auVar39;
      auVar99._4_60_ = auVar100._4_60_;
      auVar99._0_4_ = (uint)bVar34 * auVar53._0_4_ + (uint)!bVar34 * auVar39._0_4_;
      auVar53 = vmaxss_avx512f(auVar50,auVar97._0_16_);
      auVar87._0_16_ = vminss_avx512f(auVar99._0_16_,auVar47);
    } while (auVar87._0_4_ < auVar53._0_4_);
    auVar60 = vmaxss_avx512f(auVar50,ZEXT416((uint)(auVar53._0_4_ + -0.1)));
    auVar59 = vminss_avx512f(ZEXT416((uint)(auVar87._0_4_ + 0.1)),auVar47);
    auVar138._0_8_ = auVar64._0_8_;
    auVar138._8_8_ = auVar138._0_8_;
    auVar223._8_8_ = auVar186._0_8_;
    auVar223._0_8_ = auVar186._0_8_;
    auVar242._8_8_ = auVar46._0_8_;
    auVar242._0_8_ = auVar46._0_8_;
    auVar53 = vshufpd_avx(auVar186,auVar186,3);
    auVar54 = vshufpd_avx(auVar46,auVar46,3);
    auVar38 = vshufps_avx(auVar60,auVar59,0);
    auVar257._8_4_ = 0x3f800000;
    auVar257._0_8_ = 0x3f8000003f800000;
    auVar257._12_4_ = 0x3f800000;
    auVar39 = vsubps_avx(auVar257,auVar38);
    fVar220 = auVar38._0_4_;
    auVar178._0_4_ = fVar220 * auVar40._0_4_;
    fVar231 = auVar38._4_4_;
    auVar178._4_4_ = fVar231 * auVar40._4_4_;
    fVar232 = auVar38._8_4_;
    auVar178._8_4_ = fVar232 * auVar40._8_4_;
    fVar233 = auVar38._12_4_;
    auVar178._12_4_ = fVar233 * auVar40._12_4_;
    auVar187._0_4_ = fVar220 * auVar53._0_4_;
    auVar187._4_4_ = fVar231 * auVar53._4_4_;
    auVar187._8_4_ = fVar232 * auVar53._8_4_;
    auVar187._12_4_ = fVar233 * auVar53._12_4_;
    auVar262._0_4_ = auVar54._0_4_ * fVar220;
    auVar262._4_4_ = auVar54._4_4_ * fVar231;
    auVar262._8_4_ = auVar54._8_4_ * fVar232;
    auVar262._12_4_ = auVar54._12_4_ * fVar233;
    auVar165._0_4_ = fVar220 * auVar41._0_4_;
    auVar165._4_4_ = fVar231 * auVar41._4_4_;
    auVar165._8_4_ = fVar232 * auVar41._8_4_;
    auVar165._12_4_ = fVar233 * auVar41._12_4_;
    auVar40 = vfmadd231ps_fma(auVar178,auVar39,auVar138);
    auVar41 = vfmadd231ps_fma(auVar187,auVar39,auVar223);
    auVar42 = vfmadd231ps_fma(auVar262,auVar39,auVar242);
    auVar43 = vfmadd231ps_fma(auVar165,auVar39,ZEXT816(0));
    auVar54 = vsubss_avx512f(auVar47,auVar60);
    auVar53 = vmovshdup_avx(auVar120);
    auVar58 = vfmadd231ss_fma(ZEXT416((uint)(auVar53._0_4_ * auVar60._0_4_)),auVar120,auVar54);
    auVar54 = vsubss_avx512f(auVar47,auVar59);
    auVar59 = vfmadd231ss_fma(ZEXT416((uint)(auVar53._0_4_ * auVar59._0_4_)),auVar120,auVar54);
    auVar46 = vdivss_avx512f(auVar47,ZEXT416((uint)fVar236));
    auVar53 = vsubps_avx(auVar41,auVar40);
    auVar38 = vmulps_avx512vl(auVar53,auVar52);
    auVar53 = vsubps_avx(auVar42,auVar41);
    auVar39 = vmulps_avx512vl(auVar53,auVar52);
    auVar53 = vsubps_avx(auVar43,auVar42);
    auVar53 = vmulps_avx512vl(auVar53,auVar52);
    auVar54 = vminps_avx(auVar39,auVar53);
    auVar53 = vmaxps_avx(auVar39,auVar53);
    auVar54 = vminps_avx(auVar38,auVar54);
    auVar53 = vmaxps_avx(auVar38,auVar53);
    auVar38 = vshufpd_avx(auVar54,auVar54,3);
    auVar39 = vshufpd_avx(auVar53,auVar53,3);
    auVar54 = vminps_avx(auVar54,auVar38);
    auVar53 = vmaxps_avx(auVar53,auVar39);
    fVar236 = auVar46._0_4_;
    auVar211._0_4_ = auVar54._0_4_ * fVar236;
    auVar211._4_4_ = auVar54._4_4_ * fVar236;
    auVar211._8_4_ = auVar54._8_4_ * fVar236;
    auVar211._12_4_ = auVar54._12_4_ * fVar236;
    auVar198._0_4_ = fVar236 * auVar53._0_4_;
    auVar198._4_4_ = fVar236 * auVar53._4_4_;
    auVar198._8_4_ = fVar236 * auVar53._8_4_;
    auVar198._12_4_ = fVar236 * auVar53._12_4_;
    auVar46 = vdivss_avx512f(auVar47,ZEXT416((uint)(auVar59._0_4_ - auVar58._0_4_)));
    auVar53 = vshufpd_avx(auVar40,auVar40,3);
    auVar54 = vshufpd_avx(auVar41,auVar41,3);
    auVar38 = vshufpd_avx(auVar42,auVar42,3);
    auVar39 = vshufpd_avx(auVar43,auVar43,3);
    auVar53 = vsubps_avx(auVar53,auVar40);
    auVar40 = vsubps_avx(auVar54,auVar41);
    auVar41 = vsubps_avx(auVar38,auVar42);
    auVar39 = vsubps_avx(auVar39,auVar43);
    auVar54 = vminps_avx(auVar53,auVar40);
    auVar53 = vmaxps_avx(auVar53,auVar40);
    auVar38 = vminps_avx(auVar41,auVar39);
    auVar38 = vminps_avx(auVar54,auVar38);
    auVar54 = vmaxps_avx(auVar41,auVar39);
    auVar53 = vmaxps_avx(auVar53,auVar54);
    fVar236 = auVar46._0_4_;
    auVar243._0_4_ = fVar236 * auVar38._0_4_;
    auVar243._4_4_ = fVar236 * auVar38._4_4_;
    auVar243._8_4_ = fVar236 * auVar38._8_4_;
    auVar243._12_4_ = fVar236 * auVar38._12_4_;
    auVar224._0_4_ = fVar236 * auVar53._0_4_;
    auVar224._4_4_ = fVar236 * auVar53._4_4_;
    auVar224._8_4_ = fVar236 * auVar53._8_4_;
    auVar224._12_4_ = fVar236 * auVar53._12_4_;
    auVar39 = vinsertps_avx(auVar36,auVar58,0x10);
    auVar61 = vpermt2ps_avx512vl(auVar36,_DAT_01feecd0,auVar59);
    auVar121._0_4_ = auVar39._0_4_ + auVar61._0_4_;
    auVar121._4_4_ = auVar39._4_4_ + auVar61._4_4_;
    auVar121._8_4_ = auVar39._8_4_ + auVar61._8_4_;
    auVar121._12_4_ = auVar39._12_4_ + auVar61._12_4_;
    auVar19._8_4_ = 0x3f000000;
    auVar19._0_8_ = 0x3f0000003f000000;
    auVar19._12_4_ = 0x3f000000;
    auVar46 = vmulps_avx512vl(auVar121,auVar19);
    auVar54 = vshufps_avx(auVar46,auVar46,0x54);
    uVar106 = auVar46._0_4_;
    auVar124._4_4_ = uVar106;
    auVar124._0_4_ = uVar106;
    auVar124._8_4_ = uVar106;
    auVar124._12_4_ = uVar106;
    auVar41 = vfmadd213ps_avx512vl(local_450,auVar124,auVar49);
    auVar38 = vfmadd213ps_fma(local_460,auVar124,auVar45);
    auVar40 = vfmadd213ps_fma(local_470,auVar124,auVar44);
    auVar53 = vsubps_avx(auVar38,auVar41);
    auVar41 = vfmadd213ps_fma(auVar53,auVar124,auVar41);
    auVar53 = vsubps_avx(auVar40,auVar38);
    auVar53 = vfmadd213ps_fma(auVar53,auVar124,auVar38);
    auVar53 = vsubps_avx(auVar53,auVar41);
    auVar38 = vfmadd231ps_fma(auVar41,auVar53,auVar124);
    auVar42 = vmulps_avx512vl(auVar53,auVar52);
    auVar249._8_8_ = auVar38._0_8_;
    auVar249._0_8_ = auVar38._0_8_;
    auVar53 = vshufpd_avx(auVar38,auVar38,3);
    auVar38 = vshufps_avx(auVar46,auVar46,0x55);
    auVar40 = vsubps_avx(auVar53,auVar249);
    auVar41 = vfmadd231ps_fma(auVar249,auVar38,auVar40);
    auVar263._8_8_ = auVar42._0_8_;
    auVar263._0_8_ = auVar42._0_8_;
    auVar53 = vshufpd_avx(auVar42,auVar42,3);
    auVar53 = vsubps_avx512vl(auVar53,auVar263);
    auVar53 = vfmadd213ps_avx512vl(auVar53,auVar38,auVar263);
    auVar125._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
    auVar125._8_4_ = auVar40._8_4_ ^ 0x80000000;
    auVar125._12_4_ = auVar40._12_4_ ^ 0x80000000;
    auVar38 = vmovshdup_avx512vl(auVar53);
    auVar264._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
    auVar264._8_4_ = auVar38._8_4_ ^ 0x80000000;
    auVar264._12_4_ = auVar38._12_4_ ^ 0x80000000;
    auVar42 = vmovshdup_avx512vl(auVar40);
    auVar43 = vpermt2ps_avx512vl(auVar264,ZEXT416(5),auVar40);
    auVar38 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar38._0_4_ * auVar40._0_4_)),auVar53,auVar42);
    auVar40 = vpermt2ps_avx512vl(auVar53,SUB6416(ZEXT464(4),0),auVar125);
    auVar166._0_4_ = auVar38._0_4_;
    auVar166._4_4_ = auVar166._0_4_;
    auVar166._8_4_ = auVar166._0_4_;
    auVar166._12_4_ = auVar166._0_4_;
    auVar53 = vdivps_avx(auVar43,auVar166);
    auVar62 = vdivps_avx512vl(auVar40,auVar166);
    fVar236 = auVar41._0_4_;
    auVar38 = vshufps_avx(auVar41,auVar41,0x55);
    auVar250._0_4_ = fVar236 * auVar53._0_4_ + auVar38._0_4_ * auVar62._0_4_;
    auVar250._4_4_ = fVar236 * auVar53._4_4_ + auVar38._4_4_ * auVar62._4_4_;
    auVar250._8_4_ = fVar236 * auVar53._8_4_ + auVar38._8_4_ * auVar62._8_4_;
    auVar250._12_4_ = fVar236 * auVar53._12_4_ + auVar38._12_4_ * auVar62._12_4_;
    auVar60 = vsubps_avx(auVar54,auVar250);
    auVar38 = vmovshdup_avx(auVar53);
    auVar54 = vinsertps_avx(auVar211,auVar243,0x1c);
    auVar265._0_4_ = auVar38._0_4_ * auVar54._0_4_;
    auVar265._4_4_ = auVar38._4_4_ * auVar54._4_4_;
    auVar265._8_4_ = auVar38._8_4_ * auVar54._8_4_;
    auVar265._12_4_ = auVar38._12_4_ * auVar54._12_4_;
    auVar64 = vinsertps_avx512f(auVar198,auVar224,0x1c);
    auVar38 = vmulps_avx512vl(auVar38,auVar64);
    auVar43 = vminps_avx512vl(auVar265,auVar38);
    auVar41 = vmaxps_avx(auVar38,auVar265);
    auVar42 = vmovshdup_avx(auVar62);
    auVar38 = vinsertps_avx(auVar243,auVar211,0x4c);
    auVar244._0_4_ = auVar42._0_4_ * auVar38._0_4_;
    auVar244._4_4_ = auVar42._4_4_ * auVar38._4_4_;
    auVar244._8_4_ = auVar42._8_4_ * auVar38._8_4_;
    auVar244._12_4_ = auVar42._12_4_ * auVar38._12_4_;
    auVar40 = vinsertps_avx(auVar224,auVar198,0x4c);
    auVar225._0_4_ = auVar42._0_4_ * auVar40._0_4_;
    auVar225._4_4_ = auVar42._4_4_ * auVar40._4_4_;
    auVar225._8_4_ = auVar42._8_4_ * auVar40._8_4_;
    auVar225._12_4_ = auVar42._12_4_ * auVar40._12_4_;
    auVar42 = vminps_avx(auVar244,auVar225);
    auVar43 = vaddps_avx512vl(auVar43,auVar42);
    auVar42 = vmaxps_avx(auVar225,auVar244);
    auVar226._0_4_ = auVar41._0_4_ + auVar42._0_4_;
    auVar226._4_4_ = auVar41._4_4_ + auVar42._4_4_;
    auVar226._8_4_ = auVar41._8_4_ + auVar42._8_4_;
    auVar226._12_4_ = auVar41._12_4_ + auVar42._12_4_;
    auVar245._8_8_ = 0x3f80000000000000;
    auVar245._0_8_ = 0x3f80000000000000;
    auVar41 = vsubps_avx(auVar245,auVar226);
    auVar42 = vsubps_avx(auVar245,auVar43);
    auVar43 = vsubps_avx(auVar39,auVar46);
    auVar46 = vsubps_avx(auVar61,auVar46);
    fVar233 = auVar43._0_4_;
    auVar266._0_4_ = fVar233 * auVar41._0_4_;
    fVar234 = auVar43._4_4_;
    auVar266._4_4_ = fVar234 * auVar41._4_4_;
    fVar235 = auVar43._8_4_;
    auVar266._8_4_ = fVar235 * auVar41._8_4_;
    fVar181 = auVar43._12_4_;
    auVar266._12_4_ = fVar181 * auVar41._12_4_;
    auVar63 = vbroadcastss_avx512vl(auVar53);
    auVar54 = vmulps_avx512vl(auVar63,auVar54);
    auVar64 = vmulps_avx512vl(auVar63,auVar64);
    auVar63 = vminps_avx512vl(auVar54,auVar64);
    auVar64 = vmaxps_avx512vl(auVar64,auVar54);
    auVar54 = vbroadcastss_avx512vl(auVar62);
    auVar38 = vmulps_avx512vl(auVar54,auVar38);
    auVar54 = vmulps_avx512vl(auVar54,auVar40);
    auVar40 = vminps_avx512vl(auVar38,auVar54);
    auVar40 = vaddps_avx512vl(auVar63,auVar40);
    auVar43 = vmulps_avx512vl(auVar43,auVar42);
    in_ZMM17 = ZEXT1664(auVar43);
    fVar236 = auVar46._0_4_;
    auVar227._0_4_ = fVar236 * auVar41._0_4_;
    fVar220 = auVar46._4_4_;
    auVar227._4_4_ = fVar220 * auVar41._4_4_;
    fVar231 = auVar46._8_4_;
    auVar227._8_4_ = fVar231 * auVar41._8_4_;
    fVar232 = auVar46._12_4_;
    auVar227._12_4_ = fVar232 * auVar41._12_4_;
    auVar246._0_4_ = fVar236 * auVar42._0_4_;
    auVar246._4_4_ = fVar220 * auVar42._4_4_;
    auVar246._8_4_ = fVar231 * auVar42._8_4_;
    auVar246._12_4_ = fVar232 * auVar42._12_4_;
    auVar54 = vmaxps_avx(auVar54,auVar38);
    auVar199._0_4_ = auVar64._0_4_ + auVar54._0_4_;
    auVar199._4_4_ = auVar64._4_4_ + auVar54._4_4_;
    auVar199._8_4_ = auVar64._8_4_ + auVar54._8_4_;
    auVar199._12_4_ = auVar64._12_4_ + auVar54._12_4_;
    auVar212._8_8_ = 0x3f800000;
    auVar212._0_8_ = 0x3f800000;
    auVar54 = vsubps_avx(auVar212,auVar199);
    auVar38 = vsubps_avx512vl(auVar212,auVar40);
    auVar258._0_4_ = fVar233 * auVar54._0_4_;
    auVar258._4_4_ = fVar234 * auVar54._4_4_;
    auVar258._8_4_ = fVar235 * auVar54._8_4_;
    auVar258._12_4_ = fVar181 * auVar54._12_4_;
    auVar251._0_4_ = fVar233 * auVar38._0_4_;
    auVar251._4_4_ = fVar234 * auVar38._4_4_;
    auVar251._8_4_ = fVar235 * auVar38._8_4_;
    auVar251._12_4_ = fVar181 * auVar38._12_4_;
    auVar200._0_4_ = fVar236 * auVar54._0_4_;
    auVar200._4_4_ = fVar220 * auVar54._4_4_;
    auVar200._8_4_ = fVar231 * auVar54._8_4_;
    auVar200._12_4_ = fVar232 * auVar54._12_4_;
    auVar213._0_4_ = fVar236 * auVar38._0_4_;
    auVar213._4_4_ = fVar220 * auVar38._4_4_;
    auVar213._8_4_ = fVar231 * auVar38._8_4_;
    auVar213._12_4_ = fVar232 * auVar38._12_4_;
    auVar54 = vminps_avx(auVar258,auVar251);
    auVar38 = vminps_avx512vl(auVar200,auVar213);
    auVar40 = vminps_avx512vl(auVar54,auVar38);
    auVar54 = vmaxps_avx(auVar251,auVar258);
    auVar38 = vmaxps_avx(auVar213,auVar200);
    auVar38 = vmaxps_avx(auVar38,auVar54);
    auVar41 = vminps_avx512vl(auVar266,auVar43);
    auVar54 = vminps_avx(auVar227,auVar246);
    auVar54 = vminps_avx(auVar41,auVar54);
    auVar54 = vhaddps_avx(auVar40,auVar54);
    auVar41 = vmaxps_avx512vl(auVar43,auVar266);
    auVar40 = vmaxps_avx(auVar246,auVar227);
    auVar40 = vmaxps_avx(auVar40,auVar41);
    auVar38 = vhaddps_avx(auVar38,auVar40);
    auVar54 = vshufps_avx(auVar54,auVar54,0xe8);
    auVar38 = vshufps_avx(auVar38,auVar38,0xe8);
    auVar201._0_4_ = auVar54._0_4_ + auVar60._0_4_;
    auVar201._4_4_ = auVar54._4_4_ + auVar60._4_4_;
    auVar201._8_4_ = auVar54._8_4_ + auVar60._8_4_;
    auVar201._12_4_ = auVar54._12_4_ + auVar60._12_4_;
    auVar214._0_4_ = auVar38._0_4_ + auVar60._0_4_;
    auVar214._4_4_ = auVar38._4_4_ + auVar60._4_4_;
    auVar214._8_4_ = auVar38._8_4_ + auVar60._8_4_;
    auVar214._12_4_ = auVar38._12_4_ + auVar60._12_4_;
    auVar54 = vmaxps_avx(auVar39,auVar201);
    auVar38 = vminps_avx(auVar214,auVar61);
    uVar3 = vcmpps_avx512vl(auVar38,auVar54,1);
    if ((uVar3 & 3) != 0) {
      auVar87._0_16_ = auVar49;
      goto LAB_01b97b9c;
    }
    uVar3 = vcmpps_avx512vl(auVar214,auVar61,1);
    uVar14 = vcmpps_avx512vl(auVar36,auVar201,1);
    if (((ushort)uVar14 & (ushort)uVar3 & 1) == 0) {
      bVar21 = 0;
    }
    else {
      auVar54 = vmovshdup_avx(auVar201);
      bVar21 = auVar58._0_4_ < auVar54._0_4_ & (byte)(uVar3 >> 1) & 0x7f;
    }
    auVar87._0_16_ = auVar49;
    local_610 = auVar51._0_4_;
    fStack_60c = auVar51._4_4_;
    fStack_608 = auVar51._8_4_;
    fStack_604 = auVar51._12_4_;
    if (((3 < (uint)uVar23 || uVar7 != 0 && !bVar33) | bVar21) == 1) {
      lVar25 = 200;
      do {
        auVar36 = vsubss_avx512f(auVar47,auVar60);
        fVar231 = auVar36._0_4_;
        fVar236 = fVar231 * fVar231 * fVar231;
        fVar232 = auVar60._0_4_;
        fVar220 = fVar232 * 3.0 * fVar231 * fVar231;
        fVar231 = fVar231 * fVar232 * fVar232 * 3.0;
        auVar148._4_4_ = fVar236;
        auVar148._0_4_ = fVar236;
        auVar148._8_4_ = fVar236;
        auVar148._12_4_ = fVar236;
        auVar139._4_4_ = fVar220;
        auVar139._0_4_ = fVar220;
        auVar139._8_4_ = fVar220;
        auVar139._12_4_ = fVar220;
        auVar110._4_4_ = fVar231;
        auVar110._0_4_ = fVar231;
        auVar110._8_4_ = fVar231;
        auVar110._12_4_ = fVar231;
        fVar232 = fVar232 * fVar232 * fVar232;
        auVar179._0_4_ = local_610 * fVar232;
        auVar179._4_4_ = fStack_60c * fVar232;
        auVar179._8_4_ = fStack_608 * fVar232;
        auVar179._12_4_ = fStack_604 * fVar232;
        auVar36 = vfmadd231ps_fma(auVar179,auVar44,auVar110);
        auVar36 = vfmadd231ps_fma(auVar36,auVar45,auVar139);
        auVar36 = vfmadd231ps_avx512vl(auVar36,auVar49,auVar148);
        auVar111._8_8_ = auVar36._0_8_;
        auVar111._0_8_ = auVar36._0_8_;
        auVar36 = vshufpd_avx(auVar36,auVar36,3);
        auVar54 = vshufps_avx(auVar60,auVar60,0x55);
        auVar36 = vsubps_avx(auVar36,auVar111);
        auVar54 = vfmadd213ps_fma(auVar36,auVar54,auVar111);
        fVar236 = auVar54._0_4_;
        auVar36 = vshufps_avx(auVar54,auVar54,0x55);
        auVar112._0_4_ = auVar53._0_4_ * fVar236 + auVar62._0_4_ * auVar36._0_4_;
        auVar112._4_4_ = auVar53._4_4_ * fVar236 + auVar62._4_4_ * auVar36._4_4_;
        auVar112._8_4_ = auVar53._8_4_ * fVar236 + auVar62._8_4_ * auVar36._8_4_;
        auVar112._12_4_ = auVar53._12_4_ * fVar236 + auVar62._12_4_ * auVar36._12_4_;
        auVar60 = vsubps_avx(auVar60,auVar112);
        auVar36 = vandps_avx512vl(auVar54,auVar271._0_16_);
        auVar87._0_16_ = vprolq_avx512vl(auVar36,0x20);
        auVar36 = vmaxss_avx(auVar87._0_16_,auVar36);
        bVar33 = auVar36._0_4_ <= fVar114;
        if (auVar36._0_4_ < fVar114) {
          auVar36 = vucomiss_avx512f(auVar50);
          if (bVar33) {
            auVar53 = vucomiss_avx512f(auVar36);
            auVar272 = ZEXT1664(auVar53);
            if (bVar33) {
              vmovshdup_avx(auVar36);
              auVar53 = vucomiss_avx512f(auVar50);
              if (bVar33) {
                auVar54 = vucomiss_avx512f(auVar53);
                auVar272 = ZEXT1664(auVar54);
                if (bVar33) {
                  auVar38 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar47 = vinsertps_avx(auVar38,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]
                                                         ),0x28);
                  auVar38 = vdpps_avx(auVar47,local_480,0x7f);
                  auVar39 = vdpps_avx(auVar47,local_490,0x7f);
                  auVar40 = vdpps_avx(auVar47,local_4a0,0x7f);
                  auVar41 = vdpps_avx(auVar47,local_4b0,0x7f);
                  auVar42 = vdpps_avx(auVar47,local_4c0,0x7f);
                  auVar43 = vdpps_avx(auVar47,local_4d0,0x7f);
                  auVar46 = vdpps_avx(auVar47,local_4e0,0x7f);
                  auVar47 = vdpps_avx(auVar47,local_4f0,0x7f);
                  auVar60 = vsubss_avx512f(auVar54,auVar53);
                  fVar236 = auVar53._0_4_;
                  auVar53 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * auVar42._0_4_)),auVar60,auVar38
                                           );
                  auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar43._0_4_ * fVar236)),auVar60,auVar39
                                           );
                  auVar39 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * fVar236)),auVar60,auVar40
                                           );
                  auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * auVar47._0_4_)),auVar60,auVar41
                                           );
                  auVar87._0_16_ = vsubss_avx512f(auVar54,auVar36);
                  auVar180._0_4_ = auVar87._0_4_;
                  fVar236 = auVar180._0_4_ * auVar180._0_4_ * auVar180._0_4_;
                  fVar233 = auVar36._0_4_;
                  fVar220 = fVar233 * 3.0 * auVar180._0_4_ * auVar180._0_4_;
                  fVar231 = auVar180._0_4_ * fVar233 * fVar233 * 3.0;
                  fVar234 = fVar233 * fVar233 * fVar233;
                  auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar234 * auVar40._0_4_)),
                                            ZEXT416((uint)fVar231),auVar39);
                  auVar54 = vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar220),auVar38);
                  auVar53 = vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar236),auVar53);
                  fVar232 = auVar53._0_4_;
                  if ((fVar105 <= fVar232) &&
                     (fVar235 = *(float *)(ray + k * 4 + 0x200), fVar232 <= fVar235)) {
                    auVar53 = vshufps_avx(auVar36,auVar36,0x55);
                    auVar202._8_4_ = 0x3f800000;
                    auVar202._0_8_ = 0x3f8000003f800000;
                    auVar202._12_4_ = 0x3f800000;
                    auVar54 = vsubps_avx(auVar202,auVar53);
                    fVar181 = auVar53._0_4_;
                    auVar215._0_4_ = fVar181 * (float)local_540._0_4_;
                    fVar191 = auVar53._4_4_;
                    auVar215._4_4_ = fVar191 * (float)local_540._4_4_;
                    fVar192 = auVar53._8_4_;
                    auVar215._8_4_ = fVar192 * fStack_538;
                    fVar193 = auVar53._12_4_;
                    auVar215._12_4_ = fVar193 * fStack_534;
                    auVar218._0_4_ = fVar181 * (float)local_550._0_4_;
                    auVar218._4_4_ = fVar191 * (float)local_550._4_4_;
                    auVar218._8_4_ = fVar192 * fStack_548;
                    auVar218._12_4_ = fVar193 * fStack_544;
                    auVar228._0_4_ = fVar181 * (float)local_560._0_4_;
                    auVar228._4_4_ = fVar191 * (float)local_560._4_4_;
                    auVar228._8_4_ = fVar192 * fStack_558;
                    auVar228._12_4_ = fVar193 * fStack_554;
                    auVar188._0_4_ = fVar181 * (float)local_570._0_4_;
                    auVar188._4_4_ = fVar191 * (float)local_570._4_4_;
                    auVar188._8_4_ = fVar192 * fStack_568;
                    auVar188._12_4_ = fVar193 * fStack_564;
                    auVar53 = vfmadd231ps_fma(auVar215,auVar54,local_500);
                    auVar38 = vfmadd231ps_fma(auVar218,auVar54,local_510);
                    auVar39 = vfmadd231ps_fma(auVar228,auVar54,local_520);
                    auVar40 = vfmadd231ps_fma(auVar188,auVar54,local_530);
                    auVar53 = vsubps_avx(auVar38,auVar53);
                    auVar54 = vsubps_avx(auVar39,auVar38);
                    auVar38 = vsubps_avx(auVar40,auVar39);
                    auVar229._0_4_ = fVar233 * auVar54._0_4_;
                    auVar229._4_4_ = fVar233 * auVar54._4_4_;
                    auVar229._8_4_ = fVar233 * auVar54._8_4_;
                    auVar229._12_4_ = fVar233 * auVar54._12_4_;
                    auVar180._4_4_ = auVar180._0_4_;
                    auVar180._8_4_ = auVar180._0_4_;
                    auVar180._12_4_ = auVar180._0_4_;
                    auVar53 = vfmadd231ps_fma(auVar229,auVar180,auVar53);
                    auVar189._0_4_ = fVar233 * auVar38._0_4_;
                    auVar189._4_4_ = fVar233 * auVar38._4_4_;
                    auVar189._8_4_ = fVar233 * auVar38._8_4_;
                    auVar189._12_4_ = fVar233 * auVar38._12_4_;
                    auVar54 = vfmadd231ps_fma(auVar189,auVar180,auVar54);
                    auVar190._0_4_ = fVar233 * auVar54._0_4_;
                    auVar190._4_4_ = fVar233 * auVar54._4_4_;
                    auVar190._8_4_ = fVar233 * auVar54._8_4_;
                    auVar190._12_4_ = fVar233 * auVar54._12_4_;
                    auVar53 = vfmadd231ps_fma(auVar190,auVar180,auVar53);
                    auVar87._0_16_ = vmulps_avx512vl(auVar53,auVar52);
                    pGVar8 = (context->scene->geometries).items[uVar30].ptr;
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
LAB_01b98ad5:
                      bVar21 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar21 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar167._0_4_ = fVar234 * (float)local_5c0._0_4_;
                      auVar167._4_4_ = fVar234 * (float)local_5c0._4_4_;
                      auVar167._8_4_ = fVar234 * fStack_5b8;
                      auVar167._12_4_ = fVar234 * fStack_5b4;
                      auVar149._4_4_ = fVar231;
                      auVar149._0_4_ = fVar231;
                      auVar149._8_4_ = fVar231;
                      auVar149._12_4_ = fVar231;
                      auVar52 = vfmadd132ps_fma(auVar149,auVar167,local_5b0);
                      auVar140._4_4_ = fVar220;
                      auVar140._0_4_ = fVar220;
                      auVar140._8_4_ = fVar220;
                      auVar140._12_4_ = fVar220;
                      auVar52 = vfmadd132ps_fma(auVar140,auVar52,local_5a0);
                      auVar126._4_4_ = fVar236;
                      auVar126._0_4_ = fVar236;
                      auVar126._8_4_ = fVar236;
                      auVar126._12_4_ = fVar236;
                      auVar54 = vfmadd132ps_fma(auVar126,auVar52,local_590);
                      auVar52 = vshufps_avx(auVar54,auVar54,0xc9);
                      auVar53 = vshufps_avx(auVar87._0_16_,auVar87._0_16_,0xc9);
                      auVar127._0_4_ = auVar54._0_4_ * auVar53._0_4_;
                      auVar127._4_4_ = auVar54._4_4_ * auVar53._4_4_;
                      auVar127._8_4_ = auVar54._8_4_ * auVar53._8_4_;
                      auVar127._12_4_ = auVar54._12_4_ * auVar53._12_4_;
                      auVar52 = vfmsub231ps_fma(auVar127,auVar87._0_16_,auVar52);
                      local_200 = vbroadcastss_avx512f(auVar36);
                      auVar271 = vbroadcastss_avx512f(ZEXT416(1));
                      local_1c0 = vpermps_avx512f(auVar271,ZEXT1664(auVar36));
                      auVar271 = vpermps_avx512f(auVar271,ZEXT1664(auVar52));
                      auVar267 = vbroadcastss_avx512f(ZEXT416(2));
                      local_280 = vpermps_avx512f(auVar267,ZEXT1664(auVar52));
                      local_240 = vbroadcastss_avx512f(auVar52);
                      local_2c0[0] = (RTCHitN)auVar271[0];
                      local_2c0[1] = (RTCHitN)auVar271[1];
                      local_2c0[2] = (RTCHitN)auVar271[2];
                      local_2c0[3] = (RTCHitN)auVar271[3];
                      local_2c0[4] = (RTCHitN)auVar271[4];
                      local_2c0[5] = (RTCHitN)auVar271[5];
                      local_2c0[6] = (RTCHitN)auVar271[6];
                      local_2c0[7] = (RTCHitN)auVar271[7];
                      local_2c0[8] = (RTCHitN)auVar271[8];
                      local_2c0[9] = (RTCHitN)auVar271[9];
                      local_2c0[10] = (RTCHitN)auVar271[10];
                      local_2c0[0xb] = (RTCHitN)auVar271[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar271[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar271[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar271[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar271[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar271[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar271[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar271[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar271[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar271[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar271[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar271[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar271[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar271[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar271[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar271[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar271[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar271[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar271[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar271[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar271[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar271[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar271[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar271[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar271[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar271[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar271[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar271[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar271[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar271[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar271[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar271[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar271[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar271[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar271[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar271[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar271[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar271[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar271[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar271[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar271[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar271[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar271[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar271[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar271[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar271[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar271[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar271[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar271[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar271[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar271[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar271[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar271[0x3f];
                      local_180 = local_300._0_8_;
                      uStack_178 = local_300._8_8_;
                      uStack_170 = local_300._16_8_;
                      uStack_168 = local_300._24_8_;
                      uStack_160 = local_300._32_8_;
                      uStack_158 = local_300._40_8_;
                      uStack_150 = local_300._48_8_;
                      uStack_148 = local_300._56_8_;
                      auVar271 = vmovdqa64_avx512f(local_340);
                      local_140 = vmovdqa64_avx512f(auVar271);
                      vpcmpeqd_avx2(auVar271._0_32_,auVar271._0_32_);
                      local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                      *(float *)(ray + k * 4 + 0x200) = fVar232;
                      auVar101 = vmovdqa64_avx512f(local_380);
                      local_400 = vmovdqa64_avx512f(auVar101);
                      local_5f0.valid = (int *)local_400;
                      local_5f0.geometryUserPtr = pGVar8->userPtr;
                      local_5f0.context = context->user;
                      local_5f0.ray = (RTCRayN *)ray;
                      local_5f0.hit = local_2c0;
                      local_5f0.N = 0x10;
                      if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar8->occlusionFilterN)(&local_5f0);
                        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar273 = ZEXT1664(auVar36);
                        auVar272 = ZEXT464(0x3f800000);
                        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar270 = ZEXT1664(auVar36);
                        auVar36 = vxorps_avx512vl(auVar50,auVar50);
                        auVar113 = ZEXT1664(auVar36);
                        auVar101 = vmovdqa64_avx512f(local_400);
                      }
                      auVar36 = auVar113._0_16_;
                      uVar14 = vptestmd_avx512f(auVar101,auVar101);
                      auVar102._32_32_ = auVar101._32_32_;
                      if ((short)uVar14 == 0) {
                        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar271 = ZEXT1664(auVar36);
                        auVar88._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar267 = ZEXT3264(auVar88._32_32_);
                        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar268 = ZEXT1664(auVar36);
                        auVar102._0_32_ = _DAT_01feed20;
                        auVar269 = ZEXT3264(_DAT_01feed20);
                        auVar87._16_48_ = auVar102._16_48_;
                        auVar87._0_16_ = auVar49;
                      }
                      else {
                        p_Var13 = context->args->filter;
                        if (p_Var13 == (RTCFilterFunctionN)0x0) {
                          auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar271 = ZEXT1664(auVar36);
                          auVar88._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar267 = ZEXT3264(auVar88._32_32_);
                          auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar268 = ZEXT1664(auVar36);
                          auVar269 = ZEXT3264(_DAT_01feed20);
                        }
                        else {
                          auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar271 = ZEXT1664(auVar50);
                          auVar88._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar267 = ZEXT3264(auVar88._32_32_);
                          auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar268 = ZEXT1664(auVar50);
                          auVar269 = ZEXT3264(_DAT_01feed20);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var13)(&local_5f0);
                            auVar269 = ZEXT3264(_DAT_01feed20);
                            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar268 = ZEXT1664(auVar50);
                            auVar88._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar267 = ZEXT3264(auVar88._32_32_);
                            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            auVar273 = ZEXT1664(auVar50);
                            auVar272 = ZEXT464(0x3f800000);
                            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar270 = ZEXT1664(auVar50);
                            auVar36 = vxorps_avx512vl(auVar36,auVar36);
                            auVar113 = ZEXT1664(auVar36);
                            auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar271 = ZEXT1664(auVar36);
                            auVar101 = vmovdqa64_avx512f(local_400);
                          }
                        }
                        in_ZMM21 = ZEXT464(0x3e2aaaab);
                        uVar3 = vptestmd_avx512f(auVar101,auVar101);
                        auVar101 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar33 = (bool)((byte)uVar3 & 1);
                        auVar87._0_4_ =
                             (uint)bVar33 * auVar101._0_4_ |
                             (uint)!bVar33 * *(int *)(local_5f0.ray + 0x200);
                        bVar33 = (bool)((byte)(uVar3 >> 1) & 1);
                        auVar87._4_4_ =
                             (uint)bVar33 * auVar101._4_4_ |
                             (uint)!bVar33 * *(int *)(local_5f0.ray + 0x204);
                        bVar33 = (bool)((byte)(uVar3 >> 2) & 1);
                        auVar87._8_4_ =
                             (uint)bVar33 * auVar101._8_4_ |
                             (uint)!bVar33 * *(int *)(local_5f0.ray + 0x208);
                        bVar33 = (bool)((byte)(uVar3 >> 3) & 1);
                        auVar87._12_4_ =
                             (uint)bVar33 * auVar101._12_4_ |
                             (uint)!bVar33 * *(int *)(local_5f0.ray + 0x20c);
                        bVar33 = (bool)((byte)(uVar3 >> 4) & 1);
                        auVar87._16_4_ =
                             (uint)bVar33 * auVar101._16_4_ |
                             (uint)!bVar33 * *(int *)(local_5f0.ray + 0x210);
                        bVar33 = (bool)((byte)(uVar3 >> 5) & 1);
                        auVar87._20_4_ =
                             (uint)bVar33 * auVar101._20_4_ |
                             (uint)!bVar33 * *(int *)(local_5f0.ray + 0x214);
                        bVar33 = (bool)((byte)(uVar3 >> 6) & 1);
                        auVar87._24_4_ =
                             (uint)bVar33 * auVar101._24_4_ |
                             (uint)!bVar33 * *(int *)(local_5f0.ray + 0x218);
                        bVar33 = (bool)((byte)(uVar3 >> 7) & 1);
                        auVar87._28_4_ =
                             (uint)bVar33 * auVar101._28_4_ |
                             (uint)!bVar33 * *(int *)(local_5f0.ray + 0x21c);
                        bVar33 = (bool)((byte)(uVar3 >> 8) & 1);
                        auVar87._32_4_ =
                             (uint)bVar33 * auVar101._32_4_ |
                             (uint)!bVar33 * *(int *)(local_5f0.ray + 0x220);
                        bVar33 = (bool)((byte)(uVar3 >> 9) & 1);
                        auVar87._36_4_ =
                             (uint)bVar33 * auVar101._36_4_ |
                             (uint)!bVar33 * *(int *)(local_5f0.ray + 0x224);
                        bVar33 = (bool)((byte)(uVar3 >> 10) & 1);
                        auVar87._40_4_ =
                             (uint)bVar33 * auVar101._40_4_ |
                             (uint)!bVar33 * *(int *)(local_5f0.ray + 0x228);
                        bVar33 = (bool)((byte)(uVar3 >> 0xb) & 1);
                        auVar87._44_4_ =
                             (uint)bVar33 * auVar101._44_4_ |
                             (uint)!bVar33 * *(int *)(local_5f0.ray + 0x22c);
                        bVar33 = (bool)((byte)(uVar3 >> 0xc) & 1);
                        auVar87._48_4_ =
                             (uint)bVar33 * auVar101._48_4_ |
                             (uint)!bVar33 * *(int *)(local_5f0.ray + 0x230);
                        bVar33 = (bool)((byte)(uVar3 >> 0xd) & 1);
                        auVar87._52_4_ =
                             (uint)bVar33 * auVar101._52_4_ |
                             (uint)!bVar33 * *(int *)(local_5f0.ray + 0x234);
                        bVar33 = (bool)((byte)(uVar3 >> 0xe) & 1);
                        auVar87._56_4_ =
                             (uint)bVar33 * auVar101._56_4_ |
                             (uint)!bVar33 * *(int *)(local_5f0.ray + 0x238);
                        bVar33 = SUB81(uVar3 >> 0xf,0);
                        auVar87._60_4_ =
                             (uint)bVar33 * auVar101._60_4_ |
                             (uint)!bVar33 * *(int *)(local_5f0.ray + 0x23c);
                        *(undefined1 (*) [64])(local_5f0.ray + 0x200) = auVar87;
                        bVar21 = 1;
                        if ((short)uVar3 != 0) goto LAB_01b98ad7;
                      }
                      in_ZMM21 = ZEXT464(0x3e2aaaab);
                      *(float *)(ray + k * 4 + 0x200) = fVar235;
                      goto LAB_01b98ad5;
                    }
LAB_01b98ad7:
                    bVar29 = (bool)(bVar29 | bVar21);
                  }
                }
              }
            }
          }
          break;
        }
        lVar25 = lVar25 + -1;
      } while (lVar25 != 0);
      goto LAB_01b97b9c;
    }
    auVar120 = vinsertps_avx(auVar58,auVar59,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }